

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::enter(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxId *enterId,bool polish)

{
  uint *puVar1;
  double a;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  int *piVar7;
  pointer pnVar8;
  Item *pIVar9;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar10;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar11;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar25;
  int32_t iVar26;
  undefined1 auVar27 [16];
  bool bVar28;
  bool bVar29;
  int iVar30;
  uint uVar31;
  undefined4 extraout_var;
  SPxOut *pSVar32;
  _func_int **pp_Var33;
  cpp_dec_float<100U,_int,_void> *pcVar34;
  long lVar35;
  undefined7 in_register_00000011;
  cpp_dec_float<100U,_int,_void> *pcVar36;
  fpclass_type fVar37;
  ulong uVar38;
  ulong uVar39;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar40;
  pointer pUVar41;
  DataKey DVar42;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar43;
  uint uVar44;
  ulong uVar45;
  long in_FS_OFFSET;
  bool bVar46;
  Real RVar47;
  Status enterStat;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leavebound;
  SPxId none;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterTest;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterMax;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterVal;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterRO;
  cpp_dec_float<100U,_int,_void> local_6c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_16;
  uint local_628 [14];
  undefined5 uStack_5f0;
  undefined3 uStack_5eb;
  int iStack_5e8;
  undefined1 uStack_5e4;
  undefined8 local_5e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterLB;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterUB;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  undefined8 local_4e8;
  uint auStack_4e0 [13];
  undefined3 uStack_4ab;
  int iStack_4a8;
  byte bStack_4a4;
  undefined8 local_4a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_498;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  uint local_3f8 [2];
  uint auStack_3f0 [2];
  uint local_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  uint local_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint local_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  int local_3b8;
  undefined1 local_3b4;
  fpclass_type local_3b0;
  int32_t iStack_3ac;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  uint local_358 [2];
  uint auStack_350 [2];
  uint local_348;
  uint uStack_344;
  uint uStack_340;
  uint uStack_33c;
  uint local_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint local_328;
  uint uStack_324;
  uint uStack_320;
  uint uStack_31c;
  int local_318;
  undefined1 local_314;
  fpclass_type local_310;
  int32_t iStack_30c;
  cpp_dec_float<100U,_int,_void> local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_17;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268 [2];
  uint local_1c8 [2];
  uint auStack_1c0 [2];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint local_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  int local_188;
  undefined1 local_184;
  fpclass_type local_180;
  int32_t iStack_17c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  uint local_d8 [2];
  uint auStack_d0 [2];
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  int local_98;
  undefined1 local_94;
  fpclass_type local_90;
  int32_t iStack_8c;
  uint local_88 [2];
  uint auStack_80 [2];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  int local_48;
  undefined1 local_44;
  fpclass_type local_40;
  int32_t iStack_3c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rhs;
  
  none.super_DataKey.info = 0;
  none.super_DataKey.idx = -1;
  enterTest.m_backend.fpclass = cpp_dec_float_finite;
  enterTest.m_backend.prec_elem = 0x10;
  enterTest.m_backend.data._M_elems[0] = 0;
  enterTest.m_backend.data._M_elems[1] = 0;
  enterTest.m_backend.data._M_elems[2] = 0;
  enterTest.m_backend.data._M_elems[3] = 0;
  enterTest.m_backend.data._M_elems[4] = 0;
  enterTest.m_backend.data._M_elems[5] = 0;
  enterTest.m_backend.data._M_elems[6] = 0;
  enterTest.m_backend.data._M_elems[7] = 0;
  enterTest.m_backend.data._M_elems[8] = 0;
  enterTest.m_backend.data._M_elems[9] = 0;
  enterTest.m_backend.data._M_elems[10] = 0;
  enterTest.m_backend.data._M_elems[0xb] = 0;
  enterTest.m_backend.data._M_elems[0xc] = 0;
  enterTest.m_backend.data._M_elems[0xd] = 0;
  enterTest.m_backend.data._M_elems[0xe] = 0;
  enterTest.m_backend.data._M_elems[0xf] = 0;
  enterTest.m_backend.exp = 0;
  enterTest.m_backend.neg = false;
  enterUB.m_backend.fpclass = cpp_dec_float_finite;
  enterUB.m_backend.prec_elem = 0x10;
  enterUB.m_backend.data._M_elems[0] = 0;
  enterUB.m_backend.data._M_elems[1] = 0;
  enterUB.m_backend.data._M_elems[2] = 0;
  enterUB.m_backend.data._M_elems[3] = 0;
  enterUB.m_backend.data._M_elems[4] = 0;
  enterUB.m_backend.data._M_elems[5] = 0;
  enterUB.m_backend.data._M_elems[6] = 0;
  enterUB.m_backend.data._M_elems[7] = 0;
  enterUB.m_backend.data._M_elems[8] = 0;
  enterUB.m_backend.data._M_elems[9] = 0;
  enterUB.m_backend.data._M_elems[10] = 0;
  enterUB.m_backend.data._M_elems[0xb] = 0;
  enterUB.m_backend.data._M_elems[0xc] = 0;
  enterUB.m_backend.data._M_elems[0xd] = 0;
  enterUB.m_backend.data._M_elems._56_5_ = 0;
  enterUB.m_backend.data._M_elems[0xf]._1_3_ = 0;
  enterUB.m_backend.exp = 0;
  enterUB.m_backend.neg = false;
  enterLB.m_backend.fpclass = cpp_dec_float_finite;
  enterLB.m_backend.prec_elem = 0x10;
  enterLB.m_backend.data._M_elems[0] = 0;
  enterLB.m_backend.data._M_elems[1] = 0;
  enterLB.m_backend.data._M_elems[2] = 0;
  enterLB.m_backend.data._M_elems[3] = 0;
  enterLB.m_backend.data._M_elems[4] = 0;
  enterLB.m_backend.data._M_elems[5] = 0;
  enterLB.m_backend.data._M_elems[6] = 0;
  enterLB.m_backend.data._M_elems[7] = 0;
  enterLB.m_backend.data._M_elems[8] = 0;
  enterLB.m_backend.data._M_elems[9] = 0;
  enterLB.m_backend.data._M_elems[10] = 0;
  enterLB.m_backend.data._M_elems[0xb] = 0;
  enterLB.m_backend.data._M_elems[0xc] = 0;
  enterLB.m_backend.data._M_elems[0xd] = 0;
  enterLB.m_backend.data._M_elems._56_5_ = 0;
  enterLB.m_backend.data._M_elems[0xf]._1_3_ = 0;
  enterLB.m_backend.exp = 0;
  enterLB.m_backend.neg = false;
  enterVal.m_backend.fpclass = cpp_dec_float_finite;
  enterVal.m_backend.prec_elem = 0x10;
  enterVal.m_backend.data._M_elems[0] = 0;
  enterVal.m_backend.data._M_elems[1] = 0;
  enterVal.m_backend.data._M_elems[2] = 0;
  enterVal.m_backend.data._M_elems[3] = 0;
  enterVal.m_backend.data._M_elems[4] = 0;
  enterVal.m_backend.data._M_elems[5] = 0;
  enterVal.m_backend.data._M_elems[6] = 0;
  enterVal.m_backend.data._M_elems[7] = 0;
  enterVal.m_backend.data._M_elems[8] = 0;
  enterVal.m_backend.data._M_elems[9] = 0;
  enterVal.m_backend.data._M_elems[10] = 0;
  enterVal.m_backend.data._M_elems[0xb] = 0;
  enterVal.m_backend.data._M_elems[0xc] = 0;
  enterVal.m_backend.data._M_elems[0xd] = 0;
  enterVal.m_backend.data._M_elems._56_5_ = 0;
  enterVal.m_backend.data._M_elems[0xf]._1_3_ = 0;
  enterVal.m_backend.exp = 0;
  enterVal.m_backend.neg = false;
  enterMax.m_backend.fpclass = cpp_dec_float_finite;
  enterMax.m_backend.prec_elem = 0x10;
  enterMax.m_backend.data._M_elems[0] = 0;
  enterMax.m_backend.data._M_elems[1] = 0;
  enterMax.m_backend.data._M_elems[2] = 0;
  enterMax.m_backend.data._M_elems[3] = 0;
  enterMax.m_backend.data._M_elems[4] = 0;
  enterMax.m_backend.data._M_elems[5] = 0;
  enterMax.m_backend.data._M_elems[6] = 0;
  enterMax.m_backend.data._M_elems[7] = 0;
  enterMax.m_backend.data._M_elems[8] = 0;
  enterMax.m_backend.data._M_elems[9] = 0;
  enterMax.m_backend.data._M_elems[10] = 0;
  enterMax.m_backend.data._M_elems[0xb] = 0;
  enterMax.m_backend.data._M_elems[0xc] = 0;
  enterMax.m_backend.data._M_elems[0xd] = 0;
  enterMax.m_backend.data._M_elems[0xe] = 0;
  enterMax.m_backend.data._M_elems[0xf] = 0;
  enterMax.m_backend.exp = 0;
  enterMax.m_backend.neg = false;
  local_6c8.fpclass = cpp_dec_float_finite;
  local_6c8.prec_elem = 0x10;
  local_6c8.data._M_elems[0] = 0;
  local_6c8.data._M_elems[1] = 0;
  local_6c8.data._M_elems[2] = 0;
  local_6c8.data._M_elems[3] = 0;
  local_6c8.data._M_elems[4] = 0;
  local_6c8.data._M_elems[5] = 0;
  local_6c8.data._M_elems[6] = 0;
  local_6c8.data._M_elems[7] = 0;
  local_6c8.data._M_elems[8] = 0;
  local_6c8.data._M_elems[9] = 0;
  local_6c8.data._M_elems[10] = 0;
  local_6c8.data._M_elems[0xb] = 0;
  local_6c8.data._M_elems[0xc] = 0;
  local_6c8.data._M_elems[0xd] = 0;
  local_6c8.data._M_elems._56_5_ = 0;
  local_6c8.data._M_elems[0xf]._1_3_ = 0;
  local_6c8.exp = 0;
  local_6c8.neg = false;
  enterRO.m_backend.fpclass = cpp_dec_float_finite;
  enterRO.m_backend.prec_elem = 0x10;
  enterRO.m_backend.data._M_elems[0] = 0;
  enterRO.m_backend.data._M_elems[1] = 0;
  enterRO.m_backend.data._M_elems[2] = 0;
  enterRO.m_backend.data._M_elems[3] = 0;
  enterRO.m_backend.data._M_elems[4] = 0;
  enterRO.m_backend.data._M_elems[5] = 0;
  enterRO.m_backend.data._M_elems[6] = 0;
  enterRO.m_backend.data._M_elems[7] = 0;
  enterRO.m_backend.data._M_elems[8] = 0;
  enterRO.m_backend.data._M_elems[9] = 0;
  enterRO.m_backend.data._M_elems[10] = 0;
  enterRO.m_backend.data._M_elems[0xb] = 0;
  enterRO.m_backend.data._M_elems[0xc] = 0;
  enterRO.m_backend.data._M_elems[0xd] = 0;
  enterRO.m_backend.data._M_elems._56_5_ = 0;
  enterRO.m_backend.data._M_elems[0xf]._1_3_ = 0;
  enterRO.m_backend.exp = 0;
  enterRO.m_backend.neg = false;
  local_5e0._0_4_ = cpp_dec_float_finite;
  local_5e0._4_4_ = 0x10;
  local_628[0] = 0;
  local_628[1] = 0;
  local_628[2] = 0;
  local_628[3] = 0;
  local_628[4] = 0;
  local_628[5] = 0;
  local_628[6] = 0;
  local_628[7] = 0;
  local_628[8] = 0;
  local_628[9] = 0;
  local_628[10] = 0;
  local_628[0xb] = 0;
  local_628[0xc] = 0;
  local_628[0xd] = 0;
  uStack_5f0 = 0;
  uStack_5eb = 0;
  iStack_5e8 = 0;
  uStack_5e4 = 0;
  iVar30 = (*(this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._vptr_ClassArray[0x7e])();
  rhs = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)CONCAT44(extraout_var,iVar30);
  bVar29 = this->instableEnter;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x81])
            (this,enterId->super_DataKey,&enterTest,&enterUB,&enterLB,&enterVal,&enterMax,&local_6c8
             ,&enterStat,&enterRO,local_628);
  uVar24 = result.m_backend.data._M_elems._48_8_;
  uVar23 = result.m_backend._72_8_;
  if ((int)CONCAT71(in_register_00000011,polish) == 0) {
    RVar47 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&result_1,RVar47);
    uVar24._0_4_ = result_1.m_backend.data._M_elems[0xc];
    uVar24._4_4_ = result_1.m_backend.data._M_elems[0xd];
    result.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
    result.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
    result.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
    result.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
    auVar27 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
    result.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
    result.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
    result.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
    result.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
    result.m_backend.data._M_elems[10] = result_1.m_backend.data._M_elems[10];
    result.m_backend.data._M_elems[0xb] = result_1.m_backend.data._M_elems[0xb];
    result.m_backend.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
    result.m_backend.data._M_elems[9] = result_1.m_backend.data._M_elems[9];
    result.m_backend.data._M_elems[0xc] = result_1.m_backend.data._M_elems[0xc];
    result.m_backend.data._M_elems[0xd] = result_1.m_backend.data._M_elems[0xd];
    result.m_backend.data._M_elems._56_5_ =
         SUB85(CONCAT44(result_1.m_backend.data._M_elems[0xf],result_1.m_backend.data._M_elems[0xe])
               ,0);
    result.m_backend.data._M_elems[0xf]._1_3_ =
         (undefined3)(result_1.m_backend.data._M_elems[0xf] >> 8);
    result.m_backend.exp = result_1.m_backend.exp;
    result.m_backend.neg = result_1.m_backend.neg;
    uVar23._0_4_ = result_1.m_backend.fpclass;
    uVar23._4_4_ = result_1.m_backend.prec_elem;
    result.m_backend.fpclass = result_1.m_backend.fpclass;
    result.m_backend.prec_elem = result_1.m_backend.prec_elem;
    result.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
    if (result.m_backend.data._M_elems[0] != 0 || result_1.m_backend.fpclass != cpp_dec_float_finite
       ) {
      result.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
    }
    result.m_backend.data._M_elems._0_16_ = auVar27;
    if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
        (uVar24 = result.m_backend.data._M_elems._48_8_, uVar23 = result.m_backend._72_8_,
        enterTest.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar30 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&enterTest.m_backend,&result.m_backend),
       uVar24 = result.m_backend.data._M_elems._48_8_, uVar23 = result.m_backend._72_8_, 0 < iVar30)
       ) {
      local_58 = enterTest.m_backend.data._M_elems[0xc];
      uStack_54 = enterTest.m_backend.data._M_elems[0xd];
      uStack_50 = enterTest.m_backend.data._M_elems[0xe];
      uStack_4c = enterTest.m_backend.data._M_elems[0xf];
      local_68 = enterTest.m_backend.data._M_elems[8];
      uStack_64 = enterTest.m_backend.data._M_elems[9];
      uStack_60 = enterTest.m_backend.data._M_elems[10];
      uStack_5c = enterTest.m_backend.data._M_elems[0xb];
      local_78 = enterTest.m_backend.data._M_elems[4];
      uStack_74 = enterTest.m_backend.data._M_elems[5];
      uStack_70 = enterTest.m_backend.data._M_elems[6];
      uStack_6c = enterTest.m_backend.data._M_elems[7];
      local_88[0] = enterTest.m_backend.data._M_elems[0];
      local_88[1] = enterTest.m_backend.data._M_elems[1];
      auStack_80[0] = enterTest.m_backend.data._M_elems[2];
      auStack_80[1] = enterTest.m_backend.data._M_elems[3];
      local_48 = enterTest.m_backend.exp;
      local_44 = enterTest.m_backend.neg;
      local_40 = enterTest.m_backend.fpclass;
      iStack_3c = enterTest.m_backend.prec_elem;
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(this,enterId->super_DataKey,local_88,(ulong)(uint)enterStat);
      pp_Var33 = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxBasisBase;
      bVar46 = false;
      goto LAB_003bdf87;
    }
  }
  result.m_backend._72_8_ = uVar23;
  result.m_backend.data._M_elems._48_8_ = uVar24;
  pUVar40 = this->theFvec;
  if (((pUVar40->thedelta).setupStatus == true) && ((pUVar40->thedelta).super_IdxSet.num == 0)) {
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::solve4update(&this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,&pUVar40->thedelta,rhs);
  }
  if ((!polish) && (this->m_maxCycle < this->m_numCycle)) {
    result_1.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    result_1.m_backend.data._M_elems[1] = enterMax.m_backend.data._M_elems[1];
    uVar23 = result_1.m_backend.data._M_elems._0_8_;
    result_1.m_backend.data._M_elems[2] = enterMax.m_backend.data._M_elems[2];
    result_1.m_backend.data._M_elems[3] = enterMax.m_backend.data._M_elems[3];
    result_1.m_backend.data._M_elems[0xc] = enterMax.m_backend.data._M_elems[0xc];
    result_1.m_backend.data._M_elems[0xd] = enterMax.m_backend.data._M_elems[0xd];
    result_1.m_backend.data._M_elems[0xe] = enterMax.m_backend.data._M_elems[0xe];
    result_1.m_backend.data._M_elems[0xf] = enterMax.m_backend.data._M_elems[0xf];
    result_1.m_backend.data._M_elems[8] = enterMax.m_backend.data._M_elems[8];
    result_1.m_backend.data._M_elems[9] = enterMax.m_backend.data._M_elems[9];
    result_1.m_backend.data._M_elems[10] = enterMax.m_backend.data._M_elems[10];
    result_1.m_backend.data._M_elems[0xb] = enterMax.m_backend.data._M_elems[0xb];
    result_1.m_backend.data._M_elems[4] = enterMax.m_backend.data._M_elems[4];
    result_1.m_backend.data._M_elems[5] = enterMax.m_backend.data._M_elems[5];
    result_1.m_backend.data._M_elems[6] = enterMax.m_backend.data._M_elems[6];
    result_1.m_backend.data._M_elems[7] = enterMax.m_backend.data._M_elems[7];
    result_1.m_backend.exp = enterMax.m_backend.exp;
    result_1.m_backend.neg = enterMax.m_backend.neg;
    result_1.m_backend.fpclass = enterMax.m_backend.fpclass;
    result_1.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    result_1.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    result_1.m_backend.data._M_elems._0_8_ = uVar23;
    if ((result_1.m_backend.data._M_elems[0] == 0 &&
         enterMax.m_backend.fpclass == cpp_dec_float_finite) ||
       (result_1.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1),
       enterMax.m_backend.fpclass != cpp_dec_float_NaN)) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&result.m_backend,0,(type *)0x0);
      iVar30 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&result_1.m_backend,&result.m_backend);
      lVar35 = 0x450;
      if (iVar30 < 1) goto LAB_003bd3a3;
    }
    else {
LAB_003bd3a3:
      lVar35 = 0x448;
    }
    (**(code **)((long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._vptr_ClassArray + lVar35))(this);
  }
  result_1.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
  result_1.m_backend.data._M_elems[1] = enterMax.m_backend.data._M_elems[1];
  uVar23 = result_1.m_backend.data._M_elems._0_8_;
  result_1.m_backend.data._M_elems[2] = enterMax.m_backend.data._M_elems[2];
  result_1.m_backend.data._M_elems[3] = enterMax.m_backend.data._M_elems[3];
  result_1.m_backend.data._M_elems[0xc] = enterMax.m_backend.data._M_elems[0xc];
  result_1.m_backend.data._M_elems[0xd] = enterMax.m_backend.data._M_elems[0xd];
  result_1.m_backend.data._M_elems[0xe] = enterMax.m_backend.data._M_elems[0xe];
  result_1.m_backend.data._M_elems[0xf] = enterMax.m_backend.data._M_elems[0xf];
  result_1.m_backend.data._M_elems[8] = enterMax.m_backend.data._M_elems[8];
  result_1.m_backend.data._M_elems[9] = enterMax.m_backend.data._M_elems[9];
  result_1.m_backend.data._M_elems[10] = enterMax.m_backend.data._M_elems[10];
  result_1.m_backend.data._M_elems[0xb] = enterMax.m_backend.data._M_elems[0xb];
  result_1.m_backend.data._M_elems[4] = enterMax.m_backend.data._M_elems[4];
  result_1.m_backend.data._M_elems[5] = enterMax.m_backend.data._M_elems[5];
  result_1.m_backend.data._M_elems[6] = enterMax.m_backend.data._M_elems[6];
  result_1.m_backend.data._M_elems[7] = enterMax.m_backend.data._M_elems[7];
  result_1.m_backend.exp = enterMax.m_backend.exp;
  result_1.m_backend.neg = enterMax.m_backend.neg;
  result_1.m_backend.fpclass = enterMax.m_backend.fpclass;
  result_1.m_backend.prec_elem = enterMax.m_backend.prec_elem;
  result_1.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
  if (enterMax.m_backend.fpclass != cpp_dec_float_finite || result_1.m_backend.data._M_elems[0] != 0
     ) {
    result_1.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
  }
  this->boundflips = 0;
  local_a8 = enterTest.m_backend.data._M_elems[0xc];
  uStack_a4 = enterTest.m_backend.data._M_elems[0xd];
  uStack_a0 = enterTest.m_backend.data._M_elems[0xe];
  uStack_9c = enterTest.m_backend.data._M_elems[0xf];
  local_b8 = enterTest.m_backend.data._M_elems[8];
  uStack_b4 = enterTest.m_backend.data._M_elems[9];
  uStack_b0 = enterTest.m_backend.data._M_elems[10];
  uStack_ac = enterTest.m_backend.data._M_elems[0xb];
  local_c8 = enterTest.m_backend.data._M_elems[4];
  uStack_c4 = enterTest.m_backend.data._M_elems[5];
  uStack_c0 = enterTest.m_backend.data._M_elems[6];
  uStack_bc = enterTest.m_backend.data._M_elems[7];
  local_d8[0] = enterTest.m_backend.data._M_elems[0];
  local_d8[1] = enterTest.m_backend.data._M_elems[1];
  auStack_d0[0] = enterTest.m_backend.data._M_elems[2];
  auStack_d0[1] = enterTest.m_backend.data._M_elems[3];
  local_98 = enterTest.m_backend.exp;
  local_94 = enterTest.m_backend.neg;
  local_90 = enterTest.m_backend.fpclass;
  iStack_8c = enterTest.m_backend.prec_elem;
  result_1.m_backend.data._M_elems._0_8_ = uVar23;
  uVar31 = (*this->theratiotester->_vptr_SPxRatioTester[7])();
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(this->instableEnterVal).m_backend,0);
  (this->instableEnterId).super_DataKey = (DataKey)0xffffffff00000000;
  this->instableEnter = false;
  bVar46 = -1 < (int)uVar31;
  if (!bVar46) {
    local_538.m_backend.data._M_elems[0xf] = result_1.m_backend.data._M_elems[0xf];
    local_538.m_backend.data._M_elems[0xe] = result_1.m_backend.data._M_elems[0xe];
    local_538.m_backend.data._M_elems[0xc] = result_1.m_backend.data._M_elems[0xc];
    local_538.m_backend.data._M_elems[0xd] = result_1.m_backend.data._M_elems[0xd];
    local_538.m_backend.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
    local_538.m_backend.data._M_elems[9] = result_1.m_backend.data._M_elems[9];
    local_538.m_backend.data._M_elems[10] = result_1.m_backend.data._M_elems[10];
    local_538.m_backend.data._M_elems[0xb] = result_1.m_backend.data._M_elems[0xb];
    local_538.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
    local_538.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
    local_538.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
    local_538.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
    local_538.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
    local_538.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
    local_538.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
    local_538.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
    local_538.m_backend.exp = result_1.m_backend.exp;
    local_538.m_backend.neg = result_1.m_backend.neg;
    local_538.m_backend.fpclass = result_1.m_backend.fpclass;
    local_538.m_backend.prec_elem = result_1.m_backend.prec_elem;
    result_16.m_backend.data._M_elems[0xf] = enterMax.m_backend.data._M_elems[0xf];
    result_16.m_backend.data._M_elems[0xe] = enterMax.m_backend.data._M_elems[0xe];
    result_16.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    result_16.m_backend.data._M_elems[1] = enterMax.m_backend.data._M_elems[1];
    uVar23 = result_16.m_backend.data._M_elems._0_8_;
    result_16.m_backend.data._M_elems[2] = enterMax.m_backend.data._M_elems[2];
    result_16.m_backend.data._M_elems[3] = enterMax.m_backend.data._M_elems[3];
    result_16.m_backend.data._M_elems[4] = enterMax.m_backend.data._M_elems[4];
    result_16.m_backend.data._M_elems[5] = enterMax.m_backend.data._M_elems[5];
    result_16.m_backend.data._M_elems[6] = enterMax.m_backend.data._M_elems[6];
    result_16.m_backend.data._M_elems[7] = enterMax.m_backend.data._M_elems[7];
    result_16.m_backend.data._M_elems[8] = enterMax.m_backend.data._M_elems[8];
    result_16.m_backend.data._M_elems[9] = enterMax.m_backend.data._M_elems[9];
    result_16.m_backend.data._M_elems[10] = enterMax.m_backend.data._M_elems[10];
    result_16.m_backend.data._M_elems[0xb] = enterMax.m_backend.data._M_elems[0xb];
    result_16.m_backend.data._M_elems[0xc] = enterMax.m_backend.data._M_elems[0xc];
    result_16.m_backend.data._M_elems[0xd] = enterMax.m_backend.data._M_elems[0xd];
    result_16.m_backend.exp = enterMax.m_backend.exp;
    result_16.m_backend.neg = enterMax.m_backend.neg;
    result_16.m_backend.fpclass = enterMax.m_backend.fpclass;
    result_16.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    result_16.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    if (enterMax.m_backend.fpclass != cpp_dec_float_finite ||
        result_16.m_backend.data._M_elems[0] != 0) {
      result_16.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
    }
    result_16.m_backend.data._M_elems._0_8_ = uVar23;
    RVar47 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    bVar28 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_538,&result_16,RVar47);
    if (!bVar28) {
      if (!polish) {
        ::soplex::infinity::__tls_init();
        a = *(double *)(in_FS_OFFSET + -8);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x10;
        result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
        result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems._56_5_ = 0;
        result.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&result,a);
        if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
            (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar30 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&result_1.m_backend,&result.m_backend), iVar30 < 0)) {
          ::soplex::infinity::__tls_init();
          leavebound.m_backend.fpclass = cpp_dec_float_finite;
          leavebound.m_backend.prec_elem = 0x10;
          leavebound.m_backend.data._M_elems[0] = 0;
          leavebound.m_backend.data._M_elems[1] = 0;
          leavebound.m_backend.data._M_elems[2] = 0;
          leavebound.m_backend.data._M_elems[3] = 0;
          leavebound.m_backend.data._M_elems[4] = 0;
          leavebound.m_backend.data._M_elems[5] = 0;
          leavebound.m_backend.data._M_elems[6] = 0;
          leavebound.m_backend.data._M_elems[7] = 0;
          leavebound.m_backend.data._M_elems[8] = 0;
          leavebound.m_backend.data._M_elems[9] = 0;
          leavebound.m_backend.data._M_elems[10] = 0;
          leavebound.m_backend.data._M_elems[0xb] = 0;
          leavebound.m_backend.data._M_elems[0xc] = 0;
          leavebound.m_backend.data._M_elems[0xd] = 0;
          leavebound.m_backend.data._M_elems._56_5_ = 0;
          leavebound.m_backend.data._M_elems[0xf]._1_3_ = 0;
          leavebound.m_backend.exp = 0;
          leavebound.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&leavebound,-a);
          if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
              (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (iVar30 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&result_1.m_backend,&leavebound.m_backend), 0 < iVar30)) {
            (**(this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase)
                      (&this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ,0xffffffff,enterId,rhs,0);
            pUVar40 = this->theFvec;
            *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 0xc) =
                 result_1.m_backend.data._M_elems._48_8_;
            *(ulong *)((pUVar40->theval).m_backend.data._M_elems + 0xe) =
                 CONCAT44(result_1.m_backend.data._M_elems[0xf],
                          result_1.m_backend.data._M_elems[0xe]);
            *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 8) =
                 result_1.m_backend.data._M_elems._32_8_;
            *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 10) =
                 result_1.m_backend.data._M_elems._40_8_;
            *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 4) =
                 result_1.m_backend.data._M_elems._16_8_;
            *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 6) =
                 result_1.m_backend.data._M_elems._24_8_;
            *(undefined8 *)(pUVar40->theval).m_backend.data._M_elems =
                 result_1.m_backend.data._M_elems._0_8_;
            *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 2) =
                 result_1.m_backend.data._M_elems._8_8_;
            (pUVar40->theval).m_backend.exp = result_1.m_backend.exp;
            (pUVar40->theval).m_backend.neg = result_1.m_backend.neg;
            (pUVar40->theval).m_backend.fpclass = result_1.m_backend.fpclass;
            (pUVar40->theval).m_backend.prec_elem = result_1.m_backend.prec_elem;
            pUVar40 = this->theFvec;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::
            multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        *)pUVar40,&pUVar40->theval,&pUVar40->thedelta);
            local_328 = result_1.m_backend.data._M_elems[0xc];
            uStack_324 = result_1.m_backend.data._M_elems[0xd];
            uStack_320 = result_1.m_backend.data._M_elems[0xe];
            uStack_31c = result_1.m_backend.data._M_elems[0xf];
            local_338 = result_1.m_backend.data._M_elems[8];
            uStack_334 = result_1.m_backend.data._M_elems[9];
            uStack_330 = result_1.m_backend.data._M_elems[10];
            uStack_32c = result_1.m_backend.data._M_elems[0xb];
            local_348 = result_1.m_backend.data._M_elems[4];
            uStack_344 = result_1.m_backend.data._M_elems[5];
            uStack_340 = result_1.m_backend.data._M_elems[6];
            uStack_33c = result_1.m_backend.data._M_elems[7];
            local_358[0] = result_1.m_backend.data._M_elems[0];
            local_358[1] = result_1.m_backend.data._M_elems[1];
            auStack_350[0] = result_1.m_backend.data._M_elems[2];
            auStack_350[1] = result_1.m_backend.data._M_elems[3];
            local_318 = result_1.m_backend.exp;
            local_314 = result_1.m_backend.neg;
            local_310 = result_1.m_backend.fpclass;
            iStack_30c = result_1.m_backend.prec_elem;
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x83])
                      (this,enterId->super_DataKey,(ulong)(uint)enterStat,local_358,rhs,local_628);
            local_3a8.m_backend.data._M_elems[0xf]._1_3_ = uStack_5eb;
            local_3a8.m_backend.data._M_elems._56_5_ = uStack_5f0;
            local_3a8.m_backend.data._M_elems[0xc] = local_628[0xc];
            local_3a8.m_backend.data._M_elems[0xd] = local_628[0xd];
            local_3a8.m_backend.data._M_elems[8] = local_628[8];
            local_3a8.m_backend.data._M_elems[9] = local_628[9];
            local_3a8.m_backend.data._M_elems[10] = local_628[10];
            local_3a8.m_backend.data._M_elems[0xb] = local_628[0xb];
            local_3a8.m_backend.data._M_elems[4] = local_628[4];
            local_3a8.m_backend.data._M_elems[5] = local_628[5];
            local_3a8.m_backend.data._M_elems[6] = local_628[6];
            local_3a8.m_backend.data._M_elems[7] = local_628[7];
            local_3a8.m_backend.data._M_elems[0] = local_628[0];
            local_3a8.m_backend.data._M_elems[1] = local_628[1];
            local_3a8.m_backend.data._M_elems[2] = local_628[2];
            local_3a8.m_backend.data._M_elems[3] = local_628[3];
            local_3a8.m_backend.exp = iStack_5e8;
            local_3a8.m_backend.neg = (bool)uStack_5e4;
            local_3a8.m_backend.fpclass = (fpclass_type)local_5e0;
            local_3a8.m_backend.prec_elem = local_5e0._4_4_;
            updateNonbasicValue(this,&local_3a8);
            return bVar46;
          }
        }
      }
      local_3c8 = enterTest.m_backend.data._M_elems[0xc];
      uStack_3c4 = enterTest.m_backend.data._M_elems[0xd];
      uStack_3c0 = enterTest.m_backend.data._M_elems[0xe];
      uStack_3bc = enterTest.m_backend.data._M_elems[0xf];
      local_3d8 = enterTest.m_backend.data._M_elems[8];
      uStack_3d4 = enterTest.m_backend.data._M_elems[9];
      uStack_3d0 = enterTest.m_backend.data._M_elems[10];
      uStack_3cc = enterTest.m_backend.data._M_elems[0xb];
      local_3e8 = enterTest.m_backend.data._M_elems[4];
      uStack_3e4 = enterTest.m_backend.data._M_elems[5];
      uStack_3e0 = enterTest.m_backend.data._M_elems[6];
      uStack_3dc = enterTest.m_backend.data._M_elems[7];
      local_3f8[0] = enterTest.m_backend.data._M_elems[0];
      local_3f8[1] = enterTest.m_backend.data._M_elems[1];
      auStack_3f0[0] = enterTest.m_backend.data._M_elems[2];
      auStack_3f0[1] = enterTest.m_backend.data._M_elems[3];
      local_3b8 = enterTest.m_backend.exp;
      local_3b4 = enterTest.m_backend.neg;
      local_3b0 = enterTest.m_backend.fpclass;
      iStack_3ac = enterTest.m_backend.prec_elem;
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(this,enterId->super_DataKey,local_3f8,(ulong)(uint)enterStat);
      (**(this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._vptr_SPxBasisBase)
                (&this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,0xffffffff,&none,0,0);
      if (polish) {
        return bVar46;
      }
      if (1 < (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).updateCount) {
        pSVar32 = this->spxout;
        if ((pSVar32 != (SPxOut *)0x0) && (4 < (int)pSVar32->m_verbosity)) {
          result.m_backend.data._M_elems[0] = pSVar32->m_verbosity;
          leavebound.m_backend.data._M_elems[0] = 5;
          (*pSVar32->_vptr_SPxOut[2])();
          pSVar32 = soplex::operator<<(this->spxout,"IENTER01 factorization triggered in ");
          pSVar32 = soplex::operator<<(pSVar32,"enter() for feasibility test");
          std::endl<char,std::char_traits<char>>(pSVar32->m_streams[pSVar32->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&result);
        }
        (*(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x75])(this);
        return bVar46;
      }
      result.m_backend.data._M_elems[0xc] = enterTest.m_backend.data._M_elems[0xc];
      result.m_backend.data._M_elems[0xd] = enterTest.m_backend.data._M_elems[0xd];
      result.m_backend.data._M_elems._56_5_ =
           SUB85(CONCAT44(enterTest.m_backend.data._M_elems[0xf],
                          enterTest.m_backend.data._M_elems[0xe]),0);
      result.m_backend.data._M_elems[0xf]._1_3_ =
           (undefined3)(enterTest.m_backend.data._M_elems[0xf] >> 8);
      result.m_backend.data._M_elems[10] = enterTest.m_backend.data._M_elems[10];
      result.m_backend.data._M_elems[0xb] = enterTest.m_backend.data._M_elems[0xb];
      result.m_backend.data._M_elems[8] = enterTest.m_backend.data._M_elems[8];
      result.m_backend.data._M_elems[9] = enterTest.m_backend.data._M_elems[9];
      result.m_backend.data._M_elems[6] = enterTest.m_backend.data._M_elems[6];
      result.m_backend.data._M_elems[7] = enterTest.m_backend.data._M_elems[7];
      result.m_backend.data._M_elems[4] = enterTest.m_backend.data._M_elems[4];
      result.m_backend.data._M_elems[5] = enterTest.m_backend.data._M_elems[5];
      result.m_backend.data._M_elems[2] = enterTest.m_backend.data._M_elems[2];
      result.m_backend.data._M_elems[3] = enterTest.m_backend.data._M_elems[3];
      result.m_backend.data._M_elems[0] = enterTest.m_backend.data._M_elems[0];
      result.m_backend.data._M_elems[1] = enterTest.m_backend.data._M_elems[1];
      auVar27 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
      result.m_backend.exp = enterTest.m_backend.exp;
      result.m_backend.neg = enterTest.m_backend.neg;
      result.m_backend.fpclass = enterTest.m_backend.fpclass;
      result.m_backend.prec_elem = enterTest.m_backend.prec_elem;
      fVar37 = enterTest.m_backend.fpclass;
      if ((enterTest.m_backend.neg == true) &&
         (result.m_backend.data._M_elems[0] = enterTest.m_backend.data._M_elems[0],
         result.m_backend.data._M_elems[0] != 0 || fVar37 != cpp_dec_float_finite)) {
        result.m_backend.neg = false;
      }
      result.m_backend.data._M_elems._0_16_ = auVar27;
      entertol(&leavebound,this);
      if (((fVar37 != cpp_dec_float_NaN) && (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
         (iVar30 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&result.m_backend,&leavebound.m_backend), iVar30 < 0)) {
        pSVar32 = this->spxout;
        if ((pSVar32 != (SPxOut *)0x0) && (4 < (int)pSVar32->m_verbosity)) {
          result.m_backend.data._M_elems[0] = pSVar32->m_verbosity;
          leavebound.m_backend.data._M_elems[0] = 5;
          (*pSVar32->_vptr_SPxOut[2])();
          pSVar32 = soplex::operator<<(this->spxout,
                                       "IENTER11 clean up step to reduce numerical errors");
          std::endl<char,std::char_traits<char>>(pSVar32->m_streams[pSVar32->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&result);
        }
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::coSolve(&this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,&this->theCoPvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,this->theCoPrhs);
        computePvec(this);
        computeCoTest(this);
        computeTest(this);
        return bVar46;
      }
      pSVar32 = this->spxout;
      if ((pSVar32 != (SPxOut *)0x0) && (4 < (int)pSVar32->m_verbosity)) {
        result.m_backend.data._M_elems[0] = pSVar32->m_verbosity;
        leavebound.m_backend.data._M_elems[0] = 5;
        (*pSVar32->_vptr_SPxOut[2])();
        pSVar32 = soplex::operator<<(this->spxout,"IENTER02 unboundedness/infeasibility found in ");
        pSVar32 = soplex::operator<<(pSVar32,"enter()");
        std::endl<char,std::char_traits<char>>(pSVar32->m_streams[pSVar32->m_verbosity]);
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&result);
      }
      if (this->theRep != ROW) {
        local_498.m_backend.data._M_elems[0xf] = result_1.m_backend.data._M_elems[0xf];
        local_498.m_backend.data._M_elems[0xe] = result_1.m_backend.data._M_elems[0xe];
        local_498.m_backend.data._M_elems[0xc] = result_1.m_backend.data._M_elems[0xc];
        local_498.m_backend.data._M_elems[0xd] = result_1.m_backend.data._M_elems[0xd];
        local_498.m_backend.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
        local_498.m_backend.data._M_elems[9] = result_1.m_backend.data._M_elems[9];
        local_498.m_backend.data._M_elems[10] = result_1.m_backend.data._M_elems[10];
        local_498.m_backend.data._M_elems[0xb] = result_1.m_backend.data._M_elems[0xb];
        local_498.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
        local_498.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
        local_498.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
        local_498.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
        local_498.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
        local_498.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
        local_498.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
        local_498.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
        local_498.m_backend.exp = result_1.m_backend.exp;
        local_498.m_backend.neg = result_1.m_backend.neg;
        local_498.m_backend.fpclass = result_1.m_backend.fpclass;
        local_498.m_backend.prec_elem = result_1.m_backend.prec_elem;
        computePrimalray4Col(this,&local_498,(SPxId)enterId->super_DataKey);
        if (this->m_status == OPTIMAL) {
          this->m_status = UNKNOWN;
        }
        if ((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thestatus == UNBOUNDED) {
          return bVar46;
        }
        (this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus = UNBOUNDED;
        return bVar46;
      }
      local_448.m_backend.data._M_elems[0xf] = result_1.m_backend.data._M_elems[0xf];
      local_448.m_backend.data._M_elems[0xe] = result_1.m_backend.data._M_elems[0xe];
      local_448.m_backend.data._M_elems[0xc] = result_1.m_backend.data._M_elems[0xc];
      local_448.m_backend.data._M_elems[0xd] = result_1.m_backend.data._M_elems[0xd];
      local_448.m_backend.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
      local_448.m_backend.data._M_elems[9] = result_1.m_backend.data._M_elems[9];
      local_448.m_backend.data._M_elems[10] = result_1.m_backend.data._M_elems[10];
      local_448.m_backend.data._M_elems[0xb] = result_1.m_backend.data._M_elems[0xb];
      local_448.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
      local_448.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
      local_448.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
      local_448.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
      local_448.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
      local_448.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
      local_448.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
      local_448.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
      local_448.m_backend.exp = result_1.m_backend.exp;
      local_448.m_backend.neg = result_1.m_backend.neg;
      local_448.m_backend.fpclass = result_1.m_backend.fpclass;
      local_448.m_backend.prec_elem = result_1.m_backend.prec_elem;
      computeDualfarkas4Row(this,&local_448,(SPxId)enterId->super_DataKey);
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus == INFEASIBLE) {
        return bVar46;
      }
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus = INFEASIBLE;
      return bVar46;
    }
    DVar42 = enterId->super_DataKey;
    if (bVar29 == false) {
      (this->instableEnterId).super_DataKey = DVar42;
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 0xc) =
           enterTest.m_backend.data._M_elems._48_8_;
      *(ulong *)((this->instableEnterVal).m_backend.data._M_elems + 0xe) =
           CONCAT44(enterTest.m_backend.data._M_elems[0xf],enterTest.m_backend.data._M_elems[0xe]);
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 8) =
           enterTest.m_backend.data._M_elems._32_8_;
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 10) =
           enterTest.m_backend.data._M_elems._40_8_;
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 4) =
           enterTest.m_backend.data._M_elems._16_8_;
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 6) =
           enterTest.m_backend.data._M_elems._24_8_;
      *(undefined8 *)(this->instableEnterVal).m_backend.data._M_elems =
           enterTest.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 2) =
           enterTest.m_backend.data._M_elems._8_8_;
      (this->instableEnterVal).m_backend.exp = enterTest.m_backend.exp;
      (this->instableEnterVal).m_backend.neg = enterTest.m_backend.neg;
      (this->instableEnterVal).m_backend.fpclass = enterTest.m_backend.fpclass;
      (this->instableEnterVal).m_backend.prec_elem = enterTest.m_backend.prec_elem;
      DVar42 = enterId->super_DataKey;
      pcVar36 = &result_17.m_backend;
      result_17.m_backend.fpclass = cpp_dec_float_finite;
      result_17.m_backend.prec_elem = 0x10;
      result_17.m_backend.data._M_elems[0] = 0;
      result_17.m_backend.data._M_elems[1] = 0;
      result_17.m_backend.data._M_elems[2] = 0;
      result_17.m_backend.data._M_elems[3] = 0;
      result_17.m_backend.data._M_elems[4] = 0;
      result_17.m_backend.data._M_elems[5] = 0;
      result_17.m_backend.data._M_elems[6] = 0;
      result_17.m_backend.data._M_elems[7] = 0;
      result_17.m_backend.data._M_elems[8] = 0;
      result_17.m_backend.data._M_elems[9] = 0;
      result_17.m_backend.data._M_elems[10] = 0;
      result_17.m_backend.data._M_elems[0xb] = 0;
      result_17.m_backend.data._M_elems[0xc] = 0;
      result_17.m_backend.data._M_elems[0xd] = 0;
      result_17.m_backend.data._M_elems._56_5_ = 0;
      result_17.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result_17.m_backend.exp = 0;
      result_17.m_backend.neg = false;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x10;
      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems._56_5_ = 0;
      result.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&result.m_backend,10.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (pcVar36,&enterTest.m_backend,&result.m_backend);
      pp_Var33 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._vptr_ClassArray;
    }
    else {
      local_308.data._M_elems[0xf] = enterTest.m_backend.data._M_elems[0xf];
      local_308.data._M_elems[0xe] = enterTest.m_backend.data._M_elems[0xe];
      pcVar36 = &local_308;
      local_308.data._M_elems[0xc] = enterTest.m_backend.data._M_elems[0xc];
      local_308.data._M_elems[0xd] = enterTest.m_backend.data._M_elems[0xd];
      local_308.data._M_elems[8] = enterTest.m_backend.data._M_elems[8];
      local_308.data._M_elems[9] = enterTest.m_backend.data._M_elems[9];
      local_308.data._M_elems[10] = enterTest.m_backend.data._M_elems[10];
      local_308.data._M_elems[0xb] = enterTest.m_backend.data._M_elems[0xb];
      local_308.data._M_elems[4] = enterTest.m_backend.data._M_elems[4];
      local_308.data._M_elems[5] = enterTest.m_backend.data._M_elems[5];
      local_308.data._M_elems[6] = enterTest.m_backend.data._M_elems[6];
      local_308.data._M_elems[7] = enterTest.m_backend.data._M_elems[7];
      local_308.data._M_elems[0] = enterTest.m_backend.data._M_elems[0];
      local_308.data._M_elems[1] = enterTest.m_backend.data._M_elems[1];
      local_308.data._M_elems[2] = enterTest.m_backend.data._M_elems[2];
      local_308.data._M_elems[3] = enterTest.m_backend.data._M_elems[3];
      local_308.exp = enterTest.m_backend.exp;
      local_308.neg = enterTest.m_backend.neg;
      local_308.fpclass = enterTest.m_backend.fpclass;
      local_308.prec_elem = enterTest.m_backend.prec_elem;
      pp_Var33 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._vptr_ClassArray;
    }
    (*pp_Var33[0x84])(this,DVar42,pcVar36,(ulong)(uint)enterStat);
    pp_Var33 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase;
LAB_003bdf87:
    (**pp_Var33)(&this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,0xffffffff,&none,0,0);
    return bVar46;
  }
  result.m_backend.data._M_elems[0xc] = result_1.m_backend.data._M_elems[0xc];
  result.m_backend.data._M_elems[0xd] = result_1.m_backend.data._M_elems[0xd];
  result.m_backend.data._M_elems._56_5_ =
       SUB85(CONCAT44(result_1.m_backend.data._M_elems[0xf],result_1.m_backend.data._M_elems[0xe]),0
            );
  result.m_backend.data._M_elems[0xf]._1_3_ =
       (undefined3)(result_1.m_backend.data._M_elems[0xf] >> 8);
  result.m_backend.data._M_elems[10] = result_1.m_backend.data._M_elems[10];
  result.m_backend.data._M_elems[0xb] = result_1.m_backend.data._M_elems[0xb];
  result.m_backend.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
  result.m_backend.data._M_elems[9] = result_1.m_backend.data._M_elems[9];
  result.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
  result.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
  result.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
  result.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
  result.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
  result.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
  result.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
  result.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
  auVar27 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
  result.m_backend.exp = result_1.m_backend.exp;
  result.m_backend.neg = result_1.m_backend.neg;
  result.m_backend.fpclass = result_1.m_backend.fpclass;
  result.m_backend.prec_elem = result_1.m_backend.prec_elem;
  if ((result_1.m_backend.neg == true) &&
     (result.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0],
     result_1.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0))
  {
    result.m_backend.neg = false;
  }
  result.m_backend.data._M_elems._0_16_ = auVar27;
  entertol(&leavebound,this);
  if (((result.m_backend.fpclass == cpp_dec_float_NaN) ||
      (leavebound.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar30 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&result.m_backend,&leavebound.m_backend), -1 < iVar30)) {
    this->m_numCycle = this->m_numCycle / 2;
  }
  else {
    pnVar8 = (this->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[uVar31].m_backend.data;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar8[uVar31].m_backend.data._M_elems + 2);
    puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 4;
    local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 8;
    local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_128.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 0xc;
    local_128.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_128.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_128.m_backend.exp = pnVar8[uVar31].m_backend.exp;
    local_128.m_backend.neg = pnVar8[uVar31].m_backend.neg;
    local_128.m_backend.fpclass = pnVar8[uVar31].m_backend.fpclass;
    local_128.m_backend.prec_elem = pnVar8[uVar31].m_backend.prec_elem;
    pnVar8 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[uVar31].m_backend.data;
    local_178.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar8[uVar31].m_backend.data._M_elems + 2);
    puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 4;
    local_178.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_178.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 8;
    local_178.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_178.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 0xc;
    local_178.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_178.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_178.m_backend.exp = pnVar8[uVar31].m_backend.exp;
    local_178.m_backend.neg = pnVar8[uVar31].m_backend.neg;
    local_178.m_backend.fpclass = pnVar8[uVar31].m_backend.fpclass;
    local_178.m_backend.prec_elem = pnVar8[uVar31].m_backend.prec_elem;
    RVar47 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    bVar29 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_128,&local_178,RVar47);
    if (((bVar29) && (enterStat != P_FREE)) && (enterStat != D_FREE)) {
      this->m_numCycle = this->m_numCycle + 1;
      this->enterCycles = this->enterCycles + 1;
    }
  }
  pSVar2 = this->coSolveVector2;
  pSVar3 = this->coSolveVector3;
  if (pSVar3 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0) {
    if (pSVar2 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::coSolve(&this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,&this->theCoPvec->thedelta,
                &(this->unitVecs).data.
                 super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar31].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
    }
    else {
      pUVar40 = this->theCoPvec;
      pSVar3 = this->coSolveVector2rhs;
      pUVar41 = (this->unitVecs).data.
                super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).factorized == false) {
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::factorize(&this->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
      }
      pSVar6 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).factor;
      (*pSVar6->_vptr_SLinSolver[0x18])(pSVar6,&pUVar40->thedelta,pSVar2,pUVar41 + uVar31,pSVar3);
    }
  }
  else {
    pSVar43 = &this->theCoPvec->thedelta;
    pUVar41 = (this->unitVecs).data.
              super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar31;
    if (pSVar2 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
      pSVar2 = this->coSolveVector3rhs;
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).factorized == false) {
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::factorize(&this->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
      }
      pSVar6 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).factor;
      (*pSVar6->_vptr_SLinSolver[0x18])(pSVar6,pSVar43,pSVar3,pUVar41,pSVar2);
      pSVar2 = this->coSolveVector3;
      pUVar40 = this->theCoPvec;
      if (pSVar2->setupStatus == true) {
        lVar35 = (long)(pSVar2->super_IdxSet).num;
        if (0 < lVar35) {
          uVar38 = lVar35 + 1;
          do {
            piVar7 = (pSVar2->super_IdxSet).idx;
            pnVar8 = (pSVar2->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar30 = piVar7[uVar38 - 2];
            result.m_backend.data._M_elems._0_16_ =
                 *(undefined1 (*) [16])&pnVar8[iVar30].m_backend.data;
            result.m_backend.data._M_elems._16_16_ =
                 *(undefined1 (*) [16])(pnVar8[iVar30].m_backend.data._M_elems + 4);
            result.m_backend.data._M_elems._32_16_ =
                 *(undefined1 (*) [16])(pnVar8[iVar30].m_backend.data._M_elems + 8);
            puVar1 = pnVar8[iVar30].m_backend.data._M_elems + 0xc;
            result.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
            uVar23 = *(undefined8 *)(puVar1 + 2);
            result.m_backend.data._M_elems._56_5_ = SUB85(uVar23,0);
            result.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar23 >> 0x28);
            result.m_backend.exp = pnVar8[iVar30].m_backend.exp;
            result.m_backend.neg = pnVar8[iVar30].m_backend.neg;
            result.m_backend.fpclass = pnVar8[iVar30].m_backend.fpclass;
            result.m_backend.prec_elem = pnVar8[iVar30].m_backend.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&(pUVar40->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[piVar7[uVar38 - 2]].m_backend,
                       &result.m_backend);
            uVar38 = uVar38 - 1;
          } while (1 < uVar38);
        }
      }
      else {
        uVar44 = (int)((long)(pUVar40->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pUVar40->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x33333333;
        if (0 < (int)uVar44) {
          uVar38 = (ulong)(uVar44 & 0x7fffffff);
          uVar45 = uVar38 + 1;
          lVar35 = uVar38 * 0x50;
          do {
            pnVar8 = (pSVar2->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            result.m_backend.data._M_elems._0_16_ =
                 *(undefined1 (*) [16])((long)pnVar8[-1].m_backend.data._M_elems + lVar35);
            result.m_backend.data._M_elems._16_16_ =
                 *(undefined1 (*) [16])((long)pnVar8[-1].m_backend.data._M_elems + lVar35 + 0x10);
            result.m_backend.data._M_elems._32_16_ =
                 *(undefined1 (*) [16])((long)pnVar8[-1].m_backend.data._M_elems + lVar35 + 0x20);
            puVar1 = (uint *)((long)pnVar8[-1].m_backend.data._M_elems + lVar35 + 0x30);
            result.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
            uVar23 = *(undefined8 *)(puVar1 + 2);
            result.m_backend.data._M_elems._56_5_ = SUB85(uVar23,0);
            result.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar23 >> 0x28);
            result.m_backend.exp = *(int *)((long)(&pnVar8[-1].m_backend.data + 1) + lVar35);
            result.m_backend.neg = *(bool *)((long)(&pnVar8[-1].m_backend.data + 1) + lVar35 + 4U);
            result.m_backend._72_8_ =
                 *(undefined8 *)((long)(&pnVar8[-1].m_backend.data + 1) + lVar35 + 8U);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      ((cpp_dec_float<100U,_int,_void> *)
                       ((long)(pUVar40->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].
                              m_backend.data._M_elems + lVar35),&result.m_backend);
            uVar45 = uVar45 - 1;
            lVar35 = lVar35 + -0x50;
          } while (1 < uVar45);
        }
      }
    }
    else {
      pSVar4 = this->coSolveVector2rhs;
      pSVar5 = this->coSolveVector3rhs;
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).factorized == false) {
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::factorize(&this->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
      }
      pSVar6 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).factor;
      (*pSVar6->_vptr_SLinSolver[0x1a])(pSVar6,pSVar43,pSVar2,pSVar3,pUVar41,pSVar4,pSVar5);
      pSVar2 = this->coSolveVector3;
      pUVar40 = this->theCoPvec;
      if (pSVar2->setupStatus == true) {
        lVar35 = (long)(pSVar2->super_IdxSet).num;
        if (0 < lVar35) {
          uVar38 = lVar35 + 1;
          do {
            piVar7 = (pSVar2->super_IdxSet).idx;
            pnVar8 = (pSVar2->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar30 = piVar7[uVar38 - 2];
            result.m_backend.data._M_elems._0_16_ =
                 *(undefined1 (*) [16])&pnVar8[iVar30].m_backend.data;
            result.m_backend.data._M_elems._16_16_ =
                 *(undefined1 (*) [16])(pnVar8[iVar30].m_backend.data._M_elems + 4);
            result.m_backend.data._M_elems._32_16_ =
                 *(undefined1 (*) [16])(pnVar8[iVar30].m_backend.data._M_elems + 8);
            puVar1 = pnVar8[iVar30].m_backend.data._M_elems + 0xc;
            result.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
            uVar23 = *(undefined8 *)(puVar1 + 2);
            result.m_backend.data._M_elems._56_5_ = SUB85(uVar23,0);
            result.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar23 >> 0x28);
            result.m_backend.exp = pnVar8[iVar30].m_backend.exp;
            result.m_backend.neg = pnVar8[iVar30].m_backend.neg;
            result.m_backend.fpclass = pnVar8[iVar30].m_backend.fpclass;
            result.m_backend.prec_elem = pnVar8[iVar30].m_backend.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&(pUVar40->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[piVar7[uVar38 - 2]].m_backend,
                       &result.m_backend);
            uVar38 = uVar38 - 1;
          } while (1 < uVar38);
        }
      }
      else {
        uVar44 = (int)((long)(pUVar40->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pUVar40->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x33333333;
        if (0 < (int)uVar44) {
          uVar38 = (ulong)(uVar44 & 0x7fffffff);
          uVar45 = uVar38 + 1;
          lVar35 = uVar38 * 0x50;
          do {
            pnVar8 = (pSVar2->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            result.m_backend.data._M_elems._0_16_ =
                 *(undefined1 (*) [16])((long)pnVar8[-1].m_backend.data._M_elems + lVar35);
            result.m_backend.data._M_elems._16_16_ =
                 *(undefined1 (*) [16])((long)pnVar8[-1].m_backend.data._M_elems + lVar35 + 0x10);
            result.m_backend.data._M_elems._32_16_ =
                 *(undefined1 (*) [16])((long)pnVar8[-1].m_backend.data._M_elems + lVar35 + 0x20);
            puVar1 = (uint *)((long)pnVar8[-1].m_backend.data._M_elems + lVar35 + 0x30);
            result.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
            uVar23 = *(undefined8 *)(puVar1 + 2);
            result.m_backend.data._M_elems._56_5_ = SUB85(uVar23,0);
            result.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar23 >> 0x28);
            result.m_backend.exp = *(int *)((long)(&pnVar8[-1].m_backend.data + 1) + lVar35);
            result.m_backend.neg = *(bool *)((long)(&pnVar8[-1].m_backend.data + 1) + lVar35 + 4U);
            result.m_backend._72_8_ =
                 *(undefined8 *)((long)(&pnVar8[-1].m_backend.data + 1) + lVar35 + 8U);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      ((cpp_dec_float<100U,_int,_void> *)
                       ((long)(pUVar40->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].
                              m_backend.data._M_elems + lVar35),&result.m_backend);
            uVar45 = uVar45 - 1;
            lVar35 = lVar35 + -0x50;
          } while (1 < uVar45);
        }
      }
    }
  }
  if (0 < this->boundflips) {
    uVar44 = (int)((long)(this->coSolveVector3->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->coSolveVector3->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x33333333;
    if (0 < (int)uVar44) {
      uVar38 = (ulong)(uVar44 & 0x7fffffff);
      do {
        uVar45 = uVar38 - 1;
        pnVar8 = (this->coSolveVector3->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        result.m_backend.exp = pnVar8[uVar45].m_backend.exp;
        result.m_backend.neg = pnVar8[uVar45].m_backend.neg;
        result.m_backend.fpclass = pnVar8[uVar45].m_backend.fpclass;
        result.m_backend.prec_elem = pnVar8[uVar45].m_backend.prec_elem;
        result.m_backend.data._M_elems._16_16_ =
             *(undefined1 (*) [16])(pnVar8[uVar45].m_backend.data._M_elems + 4);
        result.m_backend.data._M_elems._32_16_ =
             *(undefined1 (*) [16])(pnVar8[uVar45].m_backend.data._M_elems + 8);
        puVar1 = pnVar8[uVar45].m_backend.data._M_elems + 0xc;
        result.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar23 = *(undefined8 *)(puVar1 + 2);
        result.m_backend.data._M_elems._56_5_ = SUB85(uVar23,0);
        result.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar23 >> 0x28);
        if ((result.m_backend.neg == true) &&
           (result.m_backend.data._M_elems[0] =
                 (uint)*(undefined8 *)pnVar8[uVar45].m_backend.data._M_elems,
           result.m_backend.fpclass != cpp_dec_float_finite ||
           result.m_backend.data._M_elems[0] != 0)) {
          result.m_backend.neg = false;
        }
        result.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])&pnVar8[uVar45].m_backend.data
        ;
        RVar47 = Tolerances::epsilon((this->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        leavebound.m_backend.fpclass = cpp_dec_float_finite;
        leavebound.m_backend.prec_elem = 0x10;
        leavebound.m_backend.data._M_elems[0] = 0;
        leavebound.m_backend.data._M_elems[1] = 0;
        leavebound.m_backend.data._M_elems[2] = 0;
        leavebound.m_backend.data._M_elems[3] = 0;
        leavebound.m_backend.data._M_elems[4] = 0;
        leavebound.m_backend.data._M_elems[5] = 0;
        leavebound.m_backend.data._M_elems[6] = 0;
        leavebound.m_backend.data._M_elems[7] = 0;
        leavebound.m_backend.data._M_elems[8] = 0;
        leavebound.m_backend.data._M_elems[9] = 0;
        leavebound.m_backend.data._M_elems[10] = 0;
        leavebound.m_backend.data._M_elems[0xb] = 0;
        leavebound.m_backend.data._M_elems[0xc] = 0;
        leavebound.m_backend.data._M_elems[0xd] = 0;
        leavebound.m_backend.data._M_elems._56_5_ = 0;
        leavebound.m_backend.data._M_elems[0xf]._1_3_ = 0;
        leavebound.m_backend.exp = 0;
        leavebound.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&leavebound,RVar47);
        if (((result.m_backend.fpclass != cpp_dec_float_NaN) &&
            (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar30 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&result.m_backend,&leavebound.m_backend), 0 < iVar30)) {
          pUVar40 = this->thePvec;
          pnVar8 = (this->coSolveVector3->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          leavebound.m_backend.exp = pnVar8[uVar45].m_backend.exp;
          leavebound.m_backend.neg = pnVar8[uVar45].m_backend.neg;
          leavebound.m_backend.fpclass = pnVar8[uVar45].m_backend.fpclass;
          leavebound.m_backend.prec_elem = pnVar8[uVar45].m_backend.prec_elem;
          leavebound.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[uVar45].m_backend.data;
          leavebound.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)(pnVar8[uVar45].m_backend.data._M_elems + 2);
          puVar1 = pnVar8[uVar45].m_backend.data._M_elems + 4;
          leavebound.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          leavebound.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = pnVar8[uVar45].m_backend.data._M_elems + 8;
          leavebound.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
          leavebound.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = pnVar8[uVar45].m_backend.data._M_elems + 0xc;
          leavebound.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
          uVar23 = *(undefined8 *)(puVar1 + 2);
          leavebound.m_backend.data._M_elems._56_5_ = SUB85(uVar23,0);
          leavebound.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar23 >> 0x28);
          if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
              leavebound.m_backend.data._M_elems[0] != 0) {
            leavebound.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
          }
          pIVar9 = (this->thecovectors->set).theitem;
          iVar30 = (this->thecovectors->set).thekey[uVar45].idx;
          lVar35 = (long)pIVar9[iVar30].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
          if (0 < lVar35) {
            pIVar9 = pIVar9 + iVar30;
            uVar39 = lVar35 + 1;
            lVar35 = lVar35 * 0x54;
            do {
              pcVar34 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)(pIVar9->data).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem[-1].val.m_backend.data._M_elems + lVar35);
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x10;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems._56_5_ = 0;
              result.m_backend.data._M_elems[0xf]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              pcVar36 = &leavebound.m_backend;
              if (pcVar34 != &result.m_backend) {
                result.m_backend.data._M_elems[0xc] = leavebound.m_backend.data._M_elems[0xc];
                result.m_backend.data._M_elems[0xd] = leavebound.m_backend.data._M_elems[0xd];
                result.m_backend.data._M_elems._56_5_ = leavebound.m_backend.data._M_elems._56_5_;
                result.m_backend.data._M_elems[0xf]._1_3_ =
                     leavebound.m_backend.data._M_elems[0xf]._1_3_;
                result.m_backend.data._M_elems[10] = leavebound.m_backend.data._M_elems[10];
                result.m_backend.data._M_elems[0xb] = leavebound.m_backend.data._M_elems[0xb];
                result.m_backend.data._M_elems[8] = leavebound.m_backend.data._M_elems[8];
                result.m_backend.data._M_elems[9] = leavebound.m_backend.data._M_elems[9];
                result.m_backend.data._M_elems[6] = leavebound.m_backend.data._M_elems[6];
                result.m_backend.data._M_elems[7] = leavebound.m_backend.data._M_elems[7];
                result.m_backend.data._M_elems[4] = leavebound.m_backend.data._M_elems[4];
                result.m_backend.data._M_elems[5] = leavebound.m_backend.data._M_elems[5];
                result.m_backend.data._M_elems[2] = leavebound.m_backend.data._M_elems[2];
                result.m_backend.data._M_elems[3] = leavebound.m_backend.data._M_elems[3];
                result.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
                result.m_backend.data._M_elems[1] = leavebound.m_backend.data._M_elems[1];
                result.m_backend.exp = leavebound.m_backend.exp;
                result.m_backend.neg = leavebound.m_backend.neg;
                result.m_backend.fpclass = leavebound.m_backend.fpclass;
                result.m_backend.prec_elem = leavebound.m_backend.prec_elem;
                pcVar36 = pcVar34;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        (&result.m_backend,pcVar36);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&(pUVar40->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [*(int *)((long)(&(pIVar9->data).
                                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            .m_elem[-1].val + 1) + lVar35)].m_backend,
                         &result.m_backend);
              uVar39 = uVar39 - 1;
              lVar35 = lVar35 + -0x54;
            } while (1 < uVar39);
          }
        }
        bVar29 = 1 < (long)uVar38;
        uVar38 = uVar45;
      } while (bVar29);
    }
    if ((enterId->super_DataKey).info < 1) {
      pUVar40 = this->thePvec;
      SPxRowId::SPxRowId((SPxRowId *)&result,enterId);
      pLVar25 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
    }
    else {
      pUVar40 = this->theCoPvec;
      SPxColId::SPxColId((SPxColId *)&result,enterId);
      pLVar25 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
    }
    iVar30 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(pLVar25->
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).set,(DataKey *)&result);
    pnVar8 = (pUVar40->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_6c8.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[iVar30].m_backend;
    local_6c8.data._M_elems._8_8_ = *(undefined8 *)(pnVar8[iVar30].m_backend.data._M_elems + 2);
    puVar1 = pnVar8[iVar30].m_backend.data._M_elems + 4;
    local_6c8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_6c8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar8[iVar30].m_backend.data._M_elems + 8;
    local_6c8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_6c8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar8[iVar30].m_backend.data._M_elems + 0xc;
    local_6c8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar23 = *(undefined8 *)(puVar1 + 2);
    local_6c8.data._M_elems._56_5_ = SUB85(uVar23,0);
    local_6c8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar23 >> 0x28);
    local_6c8.exp = pnVar8[iVar30].m_backend.exp;
    local_6c8.neg = pnVar8[iVar30].m_backend.neg;
    local_6c8.fpclass = pnVar8[iVar30].m_backend.fpclass;
    local_6c8.prec_elem = pnVar8[iVar30].m_backend.prec_elem;
    this->totalboundflips = this->totalboundflips + this->boundflips;
  }
  pnVar8 = (this->theCoPrhs->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar1 = enterRO.m_backend.data._M_elems._48_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(enterRO.m_backend.data._M_elems[0xf]._1_3_,enterRO.m_backend.data._M_elems._56_5_);
  puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar1 = enterRO.m_backend.data._M_elems._32_8_;
  *(undefined8 *)(puVar1 + 2) = enterRO.m_backend.data._M_elems._40_8_;
  puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = enterRO.m_backend.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = enterRO.m_backend.data._M_elems._24_8_;
  *(undefined8 *)&pnVar8[uVar31].m_backend.data = enterRO.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(pnVar8[uVar31].m_backend.data._M_elems + 2) =
       enterRO.m_backend.data._M_elems._8_8_;
  pnVar8[uVar31].m_backend.exp = enterRO.m_backend.exp;
  pnVar8[uVar31].m_backend.neg = enterRO.m_backend.neg;
  pnVar8[uVar31].m_backend.fpclass = enterRO.m_backend.fpclass;
  pnVar8[uVar31].m_backend.prec_elem = enterRO.m_backend.prec_elem;
  leavebound.m_backend.data._M_elems[0xc] = enterRO.m_backend.data._M_elems[0xc];
  leavebound.m_backend.data._M_elems[0xd] = enterRO.m_backend.data._M_elems[0xd];
  leavebound.m_backend.data._M_elems._56_5_ = enterRO.m_backend.data._M_elems._56_5_;
  leavebound.m_backend.data._M_elems[0xf]._1_3_ = enterRO.m_backend.data._M_elems[0xf]._1_3_;
  leavebound.m_backend.data._M_elems[8] = enterRO.m_backend.data._M_elems[8];
  leavebound.m_backend.data._M_elems[9] = enterRO.m_backend.data._M_elems[9];
  leavebound.m_backend.data._M_elems[10] = enterRO.m_backend.data._M_elems[10];
  leavebound.m_backend.data._M_elems[0xb] = enterRO.m_backend.data._M_elems[0xb];
  leavebound.m_backend.data._M_elems[4] = enterRO.m_backend.data._M_elems[4];
  leavebound.m_backend.data._M_elems[5] = enterRO.m_backend.data._M_elems[5];
  leavebound.m_backend.data._M_elems[6] = enterRO.m_backend.data._M_elems[6];
  leavebound.m_backend.data._M_elems[7] = enterRO.m_backend.data._M_elems[7];
  leavebound.m_backend.data._M_elems[0] = enterRO.m_backend.data._M_elems[0];
  leavebound.m_backend.data._M_elems[1] = enterRO.m_backend.data._M_elems[1];
  leavebound.m_backend.data._M_elems[2] = enterRO.m_backend.data._M_elems[2];
  leavebound.m_backend.data._M_elems[3] = enterRO.m_backend.data._M_elems[3];
  leavebound.m_backend.exp = enterRO.m_backend.exp;
  leavebound.m_backend.neg = enterRO.m_backend.neg;
  leavebound.m_backend.fpclass = enterRO.m_backend.fpclass;
  leavebound.m_backend.prec_elem = enterRO.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
            (&leavebound.m_backend,&local_6c8);
  pnVar8 = (this->theFvec->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  result_11.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[uVar31].m_backend.data;
  result_11.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar8[uVar31].m_backend.data._M_elems + 2);
  puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 4;
  result_11.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  result_11.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 8;
  result_11.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
  result_11.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 0xc;
  result_11.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
  uVar23 = *(undefined8 *)(puVar1 + 2);
  result_11.m_backend.data._M_elems._56_5_ = SUB85(uVar23,0);
  result_11.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar23 >> 0x28);
  result_11.m_backend.exp = pnVar8[uVar31].m_backend.exp;
  result_11.m_backend.neg = pnVar8[uVar31].m_backend.neg;
  result_11.m_backend.fpclass = pnVar8[uVar31].m_backend.fpclass;
  result_11.m_backend.prec_elem = pnVar8[uVar31].m_backend.prec_elem;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x10;
  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems._56_5_ = 0;
  result.m_backend.data._M_elems[0xf]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&result.m_backend,&leavebound.m_backend,&result_11.m_backend);
  pUVar40 = this->theCoPvec;
  *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 0xc) =
       result.m_backend.data._M_elems._48_8_;
  *(ulong *)((pUVar40->theval).m_backend.data._M_elems + 0xe) =
       CONCAT35(result.m_backend.data._M_elems[0xf]._1_3_,result.m_backend.data._M_elems._56_5_);
  *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 8) =
       result.m_backend.data._M_elems._32_8_;
  *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 10) =
       result.m_backend.data._M_elems._40_8_;
  *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 4) =
       result.m_backend.data._M_elems._16_8_;
  *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 6) =
       result.m_backend.data._M_elems._24_8_;
  *(undefined8 *)(pUVar40->theval).m_backend.data._M_elems = result.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 2) =
       result.m_backend.data._M_elems._8_8_;
  (pUVar40->theval).m_backend.exp = result.m_backend.exp;
  (pUVar40->theval).m_backend.neg = result.m_backend.neg;
  (pUVar40->theval).m_backend.fpclass = result.m_backend.fpclass;
  (pUVar40->theval).m_backend.prec_elem = result.m_backend.prec_elem;
  pUVar40 = this->theCoPvec;
  RVar47 = Tolerances::epsilon((this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x10;
  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems._56_5_ = 0;
  result.m_backend.data._M_elems[0xf]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&result,RVar47);
  if ((((pUVar40->theval).m_backend.fpclass == cpp_dec_float_NaN) ||
      (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar30 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&(pUVar40->theval).m_backend,&result.m_backend), iVar30 < 1)) {
    pUVar40 = this->theCoPvec;
    RVar47 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    result_11.m_backend.fpclass = cpp_dec_float_finite;
    result_11.m_backend.prec_elem = 0x10;
    result_11.m_backend.data._M_elems[0] = 0;
    result_11.m_backend.data._M_elems[1] = 0;
    result_11.m_backend.data._M_elems[2] = 0;
    result_11.m_backend.data._M_elems[3] = 0;
    result_11.m_backend.data._M_elems[4] = 0;
    result_11.m_backend.data._M_elems[5] = 0;
    result_11.m_backend.data._M_elems[6] = 0;
    result_11.m_backend.data._M_elems[7] = 0;
    result_11.m_backend.data._M_elems[8] = 0;
    result_11.m_backend.data._M_elems[9] = 0;
    result_11.m_backend.data._M_elems[10] = 0;
    result_11.m_backend.data._M_elems[0xb] = 0;
    result_11.m_backend.data._M_elems[0xc] = 0;
    result_11.m_backend.data._M_elems[0xd] = 0;
    result_11.m_backend.data._M_elems._56_5_ = 0;
    result_11.m_backend.data._M_elems[0xf]._1_3_ = 0;
    result_11.m_backend.exp = 0;
    result_11.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&result_11,RVar47);
    leavebound.m_backend.data._M_elems[0] = result_11.m_backend.data._M_elems[0];
    leavebound.m_backend.data._M_elems[1] = result_11.m_backend.data._M_elems[1];
    uVar23 = leavebound.m_backend.data._M_elems._0_8_;
    leavebound.m_backend.data._M_elems[2] = result_11.m_backend.data._M_elems[2];
    leavebound.m_backend.data._M_elems[3] = result_11.m_backend.data._M_elems[3];
    leavebound.m_backend.data._M_elems[4] = result_11.m_backend.data._M_elems[4];
    leavebound.m_backend.data._M_elems[5] = result_11.m_backend.data._M_elems[5];
    leavebound.m_backend.data._M_elems[6] = result_11.m_backend.data._M_elems[6];
    leavebound.m_backend.data._M_elems[7] = result_11.m_backend.data._M_elems[7];
    leavebound.m_backend.data._M_elems[8] = result_11.m_backend.data._M_elems[8];
    leavebound.m_backend.data._M_elems[9] = result_11.m_backend.data._M_elems[9];
    leavebound.m_backend.data._M_elems[10] = result_11.m_backend.data._M_elems[10];
    leavebound.m_backend.data._M_elems[0xb] = result_11.m_backend.data._M_elems[0xb];
    leavebound.m_backend.data._M_elems[0xc] = result_11.m_backend.data._M_elems[0xc];
    leavebound.m_backend.data._M_elems[0xd] = result_11.m_backend.data._M_elems[0xd];
    leavebound.m_backend.data._M_elems._56_5_ = result_11.m_backend.data._M_elems._56_5_;
    leavebound.m_backend.data._M_elems[0xf]._1_3_ = result_11.m_backend.data._M_elems[0xf]._1_3_;
    leavebound.m_backend.exp = result_11.m_backend.exp;
    leavebound.m_backend.neg = result_11.m_backend.neg;
    leavebound.m_backend.fpclass = result_11.m_backend.fpclass;
    leavebound.m_backend.prec_elem = result_11.m_backend.prec_elem;
    leavebound.m_backend.data._M_elems[0] = result_11.m_backend.data._M_elems[0];
    if (leavebound.m_backend.data._M_elems[0] != 0 ||
        result_11.m_backend.fpclass != cpp_dec_float_finite) {
      leavebound.m_backend.neg = (bool)(result_11.m_backend.neg ^ 1);
    }
    if (((result_11.m_backend.fpclass != cpp_dec_float_NaN) &&
        ((pUVar40->theval).m_backend.fpclass != cpp_dec_float_NaN)) &&
       (leavebound.m_backend.data._M_elems._0_8_ = uVar23,
       iVar30 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (&(pUVar40->theval).m_backend,&leavebound.m_backend), iVar30 < 0))
    goto LAB_003be74c;
  }
  else {
LAB_003be74c:
    if (this->thePricing == FULL) {
      pUVar40 = this->theCoPvec;
      pUVar10 = this->thePvec;
      uVar23 = *(undefined8 *)(pUVar40->theval).m_backend.data._M_elems;
      uVar24 = *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 2);
      uVar44 = (pUVar40->theval).m_backend.data._M_elems[4];
      uVar13 = (pUVar40->theval).m_backend.data._M_elems[5];
      uVar14 = (pUVar40->theval).m_backend.data._M_elems[6];
      uVar15 = (pUVar40->theval).m_backend.data._M_elems[7];
      uVar16 = (pUVar40->theval).m_backend.data._M_elems[8];
      uVar17 = (pUVar40->theval).m_backend.data._M_elems[9];
      uVar18 = (pUVar40->theval).m_backend.data._M_elems[10];
      uVar19 = (pUVar40->theval).m_backend.data._M_elems[0xb];
      uVar20 = (pUVar40->theval).m_backend.data._M_elems[0xd];
      uVar21 = (pUVar40->theval).m_backend.data._M_elems[0xe];
      uVar22 = (pUVar40->theval).m_backend.data._M_elems[0xf];
      (pUVar10->theval).m_backend.data._M_elems[0xc] =
           (pUVar40->theval).m_backend.data._M_elems[0xc];
      (pUVar10->theval).m_backend.data._M_elems[0xd] = uVar20;
      (pUVar10->theval).m_backend.data._M_elems[0xe] = uVar21;
      (pUVar10->theval).m_backend.data._M_elems[0xf] = uVar22;
      (pUVar10->theval).m_backend.data._M_elems[8] = uVar16;
      (pUVar10->theval).m_backend.data._M_elems[9] = uVar17;
      (pUVar10->theval).m_backend.data._M_elems[10] = uVar18;
      (pUVar10->theval).m_backend.data._M_elems[0xb] = uVar19;
      (pUVar10->theval).m_backend.data._M_elems[4] = uVar44;
      (pUVar10->theval).m_backend.data._M_elems[5] = uVar13;
      (pUVar10->theval).m_backend.data._M_elems[6] = uVar14;
      (pUVar10->theval).m_backend.data._M_elems[7] = uVar15;
      *(undefined8 *)(pUVar10->theval).m_backend.data._M_elems = uVar23;
      *(undefined8 *)((pUVar10->theval).m_backend.data._M_elems + 2) = uVar24;
      (pUVar10->theval).m_backend.exp = (pUVar40->theval).m_backend.exp;
      (pUVar10->theval).m_backend.neg = (pUVar40->theval).m_backend.neg;
      iVar26 = (pUVar40->theval).m_backend.prec_elem;
      (pUVar10->theval).m_backend.fpclass = (pUVar40->theval).m_backend.fpclass;
      (pUVar10->theval).m_backend.prec_elem = iVar26;
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x86])(this);
    }
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x87])(this);
  }
  leavebound.m_backend.fpclass = cpp_dec_float_finite;
  leavebound.m_backend.prec_elem = 0x10;
  leavebound.m_backend.data._M_elems[0] = 0;
  leavebound.m_backend.data._M_elems[1] = 0;
  leavebound.m_backend.data._M_elems[2] = 0;
  leavebound.m_backend.data._M_elems[3] = 0;
  leavebound.m_backend.data._M_elems[4] = 0;
  leavebound.m_backend.data._M_elems[5] = 0;
  leavebound.m_backend.data._M_elems[6] = 0;
  leavebound.m_backend.data._M_elems[7] = 0;
  leavebound.m_backend.data._M_elems[8] = 0;
  leavebound.m_backend.data._M_elems[9] = 0;
  leavebound.m_backend.data._M_elems[10] = 0;
  leavebound.m_backend.data._M_elems[0xb] = 0;
  leavebound.m_backend.data._M_elems[0xc] = 0;
  leavebound.m_backend.data._M_elems[0xd] = 0;
  leavebound.m_backend.data._M_elems._56_5_ = 0;
  leavebound.m_backend.data._M_elems[0xf]._1_3_ = 0;
  leavebound.m_backend.exp = 0;
  leavebound.m_backend.neg = false;
  local_1c8[0] = enterMax.m_backend.data._M_elems[0];
  local_1c8[1] = enterMax.m_backend.data._M_elems[1];
  auStack_1c0[0] = enterMax.m_backend.data._M_elems[2];
  auStack_1c0[1] = enterMax.m_backend.data._M_elems[3];
  local_1b8 = enterMax.m_backend.data._M_elems[4];
  uStack_1b4 = enterMax.m_backend.data._M_elems[5];
  uStack_1b0 = enterMax.m_backend.data._M_elems[6];
  uStack_1ac = enterMax.m_backend.data._M_elems[7];
  local_1a8 = enterMax.m_backend.data._M_elems[8];
  uStack_1a4 = enterMax.m_backend.data._M_elems[9];
  uStack_1a0 = enterMax.m_backend.data._M_elems[10];
  uStack_19c = enterMax.m_backend.data._M_elems[0xb];
  local_198 = enterMax.m_backend.data._M_elems[0xc];
  uStack_194 = enterMax.m_backend.data._M_elems[0xd];
  uStack_190 = enterMax.m_backend.data._M_elems[0xe];
  uStack_18c = enterMax.m_backend.data._M_elems[0xf];
  local_188 = enterMax.m_backend.exp;
  local_184 = enterMax.m_backend.neg;
  local_180 = enterMax.m_backend.fpclass;
  iStack_17c = enterMax.m_backend.prec_elem;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x82])(this,(ulong)uVar31,local_1c8,&leavebound,local_628);
  pnVar8 = (this->theUBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar1 = enterUB.m_backend.data._M_elems._48_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(enterUB.m_backend.data._M_elems[0xf]._1_3_,enterUB.m_backend.data._M_elems._56_5_);
  puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar1 = enterUB.m_backend.data._M_elems._32_8_;
  *(undefined8 *)(puVar1 + 2) = enterUB.m_backend.data._M_elems._40_8_;
  puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = enterUB.m_backend.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = enterUB.m_backend.data._M_elems._24_8_;
  *(undefined8 *)&pnVar8[uVar31].m_backend.data = enterUB.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(pnVar8[uVar31].m_backend.data._M_elems + 2) =
       enterUB.m_backend.data._M_elems._8_8_;
  pnVar8[uVar31].m_backend.exp = enterUB.m_backend.exp;
  pnVar8[uVar31].m_backend.neg = enterUB.m_backend.neg;
  pnVar8[uVar31].m_backend.fpclass = enterUB.m_backend.fpclass;
  pnVar8[uVar31].m_backend.prec_elem = enterUB.m_backend.prec_elem;
  pnVar8 = (this->theLBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar1 = enterLB.m_backend.data._M_elems._48_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(enterLB.m_backend.data._M_elems[0xf]._1_3_,enterLB.m_backend.data._M_elems._56_5_);
  puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar1 = enterLB.m_backend.data._M_elems._32_8_;
  *(undefined8 *)(puVar1 + 2) = enterLB.m_backend.data._M_elems._40_8_;
  puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = enterLB.m_backend.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = enterLB.m_backend.data._M_elems._24_8_;
  *(undefined8 *)&pnVar8[uVar31].m_backend.data = enterLB.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(pnVar8[uVar31].m_backend.data._M_elems + 2) =
       enterLB.m_backend.data._M_elems._8_8_;
  pnVar8[uVar31].m_backend.exp = enterLB.m_backend.exp;
  pnVar8[uVar31].m_backend.neg = enterLB.m_backend.neg;
  pnVar8[uVar31].m_backend.fpclass = enterLB.m_backend.fpclass;
  pnVar8[uVar31].m_backend.prec_elem = enterLB.m_backend.prec_elem;
  updateCoTest(this);
  if (this->thePricing == FULL) {
    updateTest(this);
  }
  pUVar40 = this->theFvec;
  *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 0xc) =
       result_1.m_backend.data._M_elems._48_8_;
  *(ulong *)((pUVar40->theval).m_backend.data._M_elems + 0xe) =
       CONCAT44(result_1.m_backend.data._M_elems[0xf],result_1.m_backend.data._M_elems[0xe]);
  *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 8) =
       result_1.m_backend.data._M_elems._32_8_;
  *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 10) =
       result_1.m_backend.data._M_elems._40_8_;
  *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 4) =
       result_1.m_backend.data._M_elems._16_8_;
  *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 6) =
       result_1.m_backend.data._M_elems._24_8_;
  *(undefined8 *)(pUVar40->theval).m_backend.data._M_elems = result_1.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((pUVar40->theval).m_backend.data._M_elems + 2) =
       result_1.m_backend.data._M_elems._8_8_;
  (pUVar40->theval).m_backend.exp = result_1.m_backend.exp;
  (pUVar40->theval).m_backend.neg = result_1.m_backend.neg;
  (pUVar40->theval).m_backend.fpclass = result_1.m_backend.fpclass;
  (pUVar40->theval).m_backend.prec_elem = result_1.m_backend.prec_elem;
  pUVar40 = this->theFvec;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)pUVar40,&pUVar40->theval,&pUVar40->thedelta);
  result.m_backend.data._M_elems[0xc] = enterVal.m_backend.data._M_elems[0xc];
  result.m_backend.data._M_elems[0xd] = enterVal.m_backend.data._M_elems[0xd];
  result.m_backend.data._M_elems._56_5_ = enterVal.m_backend.data._M_elems._56_5_;
  result.m_backend.data._M_elems[0xf]._1_3_ = enterVal.m_backend.data._M_elems[0xf]._1_3_;
  result.m_backend.data._M_elems[8] = enterVal.m_backend.data._M_elems[8];
  result.m_backend.data._M_elems[9] = enterVal.m_backend.data._M_elems[9];
  result.m_backend.data._M_elems[10] = enterVal.m_backend.data._M_elems[10];
  result.m_backend.data._M_elems[0xb] = enterVal.m_backend.data._M_elems[0xb];
  result.m_backend.data._M_elems[4] = enterVal.m_backend.data._M_elems[4];
  result.m_backend.data._M_elems[5] = enterVal.m_backend.data._M_elems[5];
  result.m_backend.data._M_elems[6] = enterVal.m_backend.data._M_elems[6];
  result.m_backend.data._M_elems[7] = enterVal.m_backend.data._M_elems[7];
  result.m_backend.data._M_elems[0] = enterVal.m_backend.data._M_elems[0];
  result.m_backend.data._M_elems[1] = enterVal.m_backend.data._M_elems[1];
  result.m_backend.data._M_elems[2] = enterVal.m_backend.data._M_elems[2];
  result.m_backend.data._M_elems[3] = enterVal.m_backend.data._M_elems[3];
  result.m_backend.exp = enterVal.m_backend.exp;
  result.m_backend.neg = enterVal.m_backend.neg;
  result.m_backend.fpclass = enterVal.m_backend.fpclass;
  result.m_backend.prec_elem = enterVal.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
            (&result.m_backend,&result_1.m_backend);
  pnVar8 = (this->theFvec->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar1 = result.m_backend.data._M_elems._48_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(result.m_backend.data._M_elems[0xf]._1_3_,result.m_backend.data._M_elems._56_5_);
  puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar1 = result.m_backend.data._M_elems._32_8_;
  *(undefined8 *)(puVar1 + 2) = result.m_backend.data._M_elems._40_8_;
  puVar1 = pnVar8[uVar31].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = result.m_backend.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = result.m_backend.data._M_elems._24_8_;
  *(undefined8 *)&pnVar8[uVar31].m_backend = result.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(pnVar8[uVar31].m_backend.data._M_elems + 2) = result.m_backend.data._M_elems._8_8_
  ;
  pnVar8[uVar31].m_backend.exp = result.m_backend.exp;
  pnVar8[uVar31].m_backend.neg = result.m_backend.neg;
  pnVar8[uVar31].m_backend.fpclass = result.m_backend.fpclass;
  pnVar8[uVar31].m_backend.prec_elem = result.m_backend.prec_elem;
  RVar47 = Tolerances::epsilon((this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x10;
  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems._56_5_ = 0;
  result.m_backend.data._M_elems[0xf]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&result.m_backend,RVar47);
  if (((leavebound.m_backend.fpclass == cpp_dec_float_NaN) ||
      (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar30 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&leavebound.m_backend,&result.m_backend), iVar30 < 1)) {
    RVar47 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    local_4a0._0_4_ = cpp_dec_float_finite;
    local_4a0._4_4_ = 0x10;
    local_4e8._0_4_ = 0;
    local_4e8._4_4_ = 0;
    auStack_4e0[0] = 0;
    auStack_4e0[1] = 0;
    auStack_4e0[2] = 0;
    auStack_4e0[3] = 0;
    auStack_4e0[4] = 0;
    auStack_4e0[5] = 0;
    auStack_4e0[6] = 0;
    auStack_4e0[7] = 0;
    auStack_4e0[8] = 0;
    auStack_4e0[9] = 0;
    auStack_4e0[10] = 0;
    auStack_4e0[0xb] = 0;
    stack0xfffffffffffffb50 = 0;
    uStack_4ab = 0;
    iStack_4a8 = 0;
    bStack_4a4 = 0;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_4e8,RVar47);
    result_11.m_backend.data._M_elems[0] = (uint)local_4e8;
    result_11.m_backend.data._M_elems[1] = local_4e8._4_4_;
    uVar23 = result_11.m_backend.data._M_elems._0_8_;
    result_11.m_backend.data._M_elems[2] = auStack_4e0[0];
    result_11.m_backend.data._M_elems[3] = auStack_4e0[1];
    result_11.m_backend.data._M_elems[4] = auStack_4e0[2];
    result_11.m_backend.data._M_elems[5] = auStack_4e0[3];
    result_11.m_backend.data._M_elems[6] = auStack_4e0[4];
    result_11.m_backend.data._M_elems[7] = auStack_4e0[5];
    result_11.m_backend.data._M_elems[8] = auStack_4e0[6];
    result_11.m_backend.data._M_elems[9] = auStack_4e0[7];
    result_11.m_backend.data._M_elems[10] = auStack_4e0[8];
    result_11.m_backend.data._M_elems[0xb] = auStack_4e0[9];
    result_11.m_backend.data._M_elems[0xc] = auStack_4e0[10];
    result_11.m_backend.data._M_elems[0xd] = auStack_4e0[0xb];
    result_11.m_backend.data._M_elems._56_5_ = stack0xfffffffffffffb50;
    result_11.m_backend.data._M_elems[0xf]._1_3_ = uStack_4ab;
    result_11.m_backend.exp = iStack_4a8;
    result_11.m_backend.neg = (bool)bStack_4a4;
    result_11.m_backend.fpclass = (fpclass_type)local_4a0;
    result_11.m_backend.prec_elem = local_4a0._4_4_;
    result_11.m_backend.data._M_elems[0] = (uint)local_4e8;
    if (result_11.m_backend.data._M_elems[0] != 0 || (fpclass_type)local_4a0 != cpp_dec_float_finite
       ) {
      result_11.m_backend.neg = (bool)(bStack_4a4 ^ 1);
    }
    result_11.m_backend.data._M_elems._0_8_ = uVar23;
    if ((((fpclass_type)local_4a0 != cpp_dec_float_NaN) &&
        (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar30 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&leavebound.m_backend,&result_11.m_backend), iVar30 < 0))
    goto LAB_003bebac;
  }
  else {
LAB_003bebac:
    pVVar11 = this->theFrhs;
    result_11.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
    result_11.m_backend.data._M_elems[1] = leavebound.m_backend.data._M_elems[1];
    uVar23 = result_11.m_backend.data._M_elems._0_8_;
    result_11.m_backend.data._M_elems[2] = leavebound.m_backend.data._M_elems[2];
    result_11.m_backend.data._M_elems[3] = leavebound.m_backend.data._M_elems[3];
    result_11.m_backend.data._M_elems[0xc] = leavebound.m_backend.data._M_elems[0xc];
    result_11.m_backend.data._M_elems[0xd] = leavebound.m_backend.data._M_elems[0xd];
    result_11.m_backend.data._M_elems._56_5_ = leavebound.m_backend.data._M_elems._56_5_;
    result_11.m_backend.data._M_elems[0xf]._1_3_ = leavebound.m_backend.data._M_elems[0xf]._1_3_;
    result_11.m_backend.data._M_elems[8] = leavebound.m_backend.data._M_elems[8];
    result_11.m_backend.data._M_elems[9] = leavebound.m_backend.data._M_elems[9];
    result_11.m_backend.data._M_elems[10] = leavebound.m_backend.data._M_elems[10];
    result_11.m_backend.data._M_elems[0xb] = leavebound.m_backend.data._M_elems[0xb];
    result_11.m_backend.data._M_elems[4] = leavebound.m_backend.data._M_elems[4];
    result_11.m_backend.data._M_elems[5] = leavebound.m_backend.data._M_elems[5];
    result_11.m_backend.data._M_elems[6] = leavebound.m_backend.data._M_elems[6];
    result_11.m_backend.data._M_elems[7] = leavebound.m_backend.data._M_elems[7];
    result_11.m_backend.exp = leavebound.m_backend.exp;
    result_11.m_backend.neg = leavebound.m_backend.neg;
    result_11.m_backend.fpclass = leavebound.m_backend.fpclass;
    result_11.m_backend.prec_elem = leavebound.m_backend.prec_elem;
    result_11.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
    if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
        result_11.m_backend.data._M_elems[0] != 0) {
      result_11.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
    }
    pSVar12 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).matrix.data[uVar31];
    lVar35 = (long)pSVar12->memused;
    result_11.m_backend.data._M_elems._0_8_ = uVar23;
    if (0 < lVar35) {
      uVar38 = lVar35 + 1;
      lVar35 = lVar35 * 0x54;
      do {
        pcVar34 = (cpp_dec_float<100U,_int,_void> *)
                  ((long)pSVar12->m_elem[-1].val.m_backend.data._M_elems + lVar35);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x10;
        result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
        result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems._56_5_ = 0;
        result.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        pcVar36 = &result_11.m_backend;
        if (pcVar34 != &result.m_backend) {
          result.m_backend.data._M_elems[0xc] = result_11.m_backend.data._M_elems[0xc];
          result.m_backend.data._M_elems[0xd] = result_11.m_backend.data._M_elems[0xd];
          result.m_backend.data._M_elems._56_5_ = result_11.m_backend.data._M_elems._56_5_;
          result.m_backend.data._M_elems[0xf]._1_3_ = result_11.m_backend.data._M_elems[0xf]._1_3_;
          result.m_backend.data._M_elems[10] = result_11.m_backend.data._M_elems[10];
          result.m_backend.data._M_elems[0xb] = result_11.m_backend.data._M_elems[0xb];
          result.m_backend.data._M_elems[8] = result_11.m_backend.data._M_elems[8];
          result.m_backend.data._M_elems[9] = result_11.m_backend.data._M_elems[9];
          result.m_backend.data._M_elems[6] = result_11.m_backend.data._M_elems[6];
          result.m_backend.data._M_elems[4] = result_11.m_backend.data._M_elems[4];
          result.m_backend.data._M_elems[5] = result_11.m_backend.data._M_elems[5];
          result.m_backend.data._M_elems[7] = result_11.m_backend.data._M_elems[7];
          result.m_backend.data._M_elems[2] = result_11.m_backend.data._M_elems[2];
          result.m_backend.data._M_elems[3] = result_11.m_backend.data._M_elems[3];
          result.m_backend.data._M_elems[0] = result_11.m_backend.data._M_elems[0];
          result.m_backend.data._M_elems[1] = result_11.m_backend.data._M_elems[1];
          result.m_backend.exp = result_11.m_backend.exp;
          result.m_backend.neg = result_11.m_backend.neg;
          result.m_backend.fpclass = result_11.m_backend.fpclass;
          result.m_backend.prec_elem = result_11.m_backend.prec_elem;
          pcVar36 = pcVar34;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                  (&result.m_backend,pcVar36);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&(pVVar11->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(int *)((long)(&pSVar12->m_elem[-1].val + 1) + lVar35)].m_backend,
                   &result.m_backend);
        uVar38 = uVar38 - 1;
        lVar35 = lVar35 + -0x54;
      } while (1 < uVar38);
    }
  }
  RVar47 = Tolerances::epsilon((this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x10;
  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems._56_5_ = 0;
  result.m_backend.data._M_elems[0xf]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&result.m_backend,RVar47);
  if (((enterVal.m_backend.fpclass == cpp_dec_float_NaN) ||
      (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar30 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&enterVal.m_backend,&result.m_backend), iVar30 < 1)) {
    RVar47 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    local_4a0._0_4_ = cpp_dec_float_finite;
    local_4a0._4_4_ = 0x10;
    local_4e8._0_4_ = 0;
    local_4e8._4_4_ = 0;
    auStack_4e0[0] = 0;
    auStack_4e0[1] = 0;
    auStack_4e0[2] = 0;
    auStack_4e0[3] = 0;
    auStack_4e0[4] = 0;
    auStack_4e0[5] = 0;
    auStack_4e0[6] = 0;
    auStack_4e0[7] = 0;
    auStack_4e0[8] = 0;
    auStack_4e0[9] = 0;
    auStack_4e0[10] = 0;
    auStack_4e0[0xb] = 0;
    stack0xfffffffffffffb50 = 0;
    uStack_4ab = 0;
    iStack_4a8 = 0;
    bStack_4a4 = 0;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_4e8,RVar47);
    result_11.m_backend.data._M_elems[0] = (uint)local_4e8;
    result_11.m_backend.data._M_elems[1] = local_4e8._4_4_;
    uVar23 = result_11.m_backend.data._M_elems._0_8_;
    result_11.m_backend.data._M_elems[2] = auStack_4e0[0];
    result_11.m_backend.data._M_elems[3] = auStack_4e0[1];
    result_11.m_backend.data._M_elems[4] = auStack_4e0[2];
    result_11.m_backend.data._M_elems[5] = auStack_4e0[3];
    result_11.m_backend.data._M_elems[6] = auStack_4e0[4];
    result_11.m_backend.data._M_elems[7] = auStack_4e0[5];
    result_11.m_backend.data._M_elems[8] = auStack_4e0[6];
    result_11.m_backend.data._M_elems[9] = auStack_4e0[7];
    result_11.m_backend.data._M_elems[10] = auStack_4e0[8];
    result_11.m_backend.data._M_elems[0xb] = auStack_4e0[9];
    result_11.m_backend.data._M_elems[0xc] = auStack_4e0[10];
    result_11.m_backend.data._M_elems[0xd] = auStack_4e0[0xb];
    result_11.m_backend.data._M_elems._56_5_ = stack0xfffffffffffffb50;
    result_11.m_backend.data._M_elems[0xf]._1_3_ = uStack_4ab;
    result_11.m_backend.exp = iStack_4a8;
    result_11.m_backend.neg = (bool)bStack_4a4;
    result_11.m_backend.fpclass = (fpclass_type)local_4a0;
    result_11.m_backend.prec_elem = local_4a0._4_4_;
    result_11.m_backend.data._M_elems[0] = (uint)local_4e8;
    if (result_11.m_backend.data._M_elems[0] != 0 || (fpclass_type)local_4a0 != cpp_dec_float_finite
       ) {
      result_11.m_backend.neg = (bool)(bStack_4a4 ^ 1);
    }
    result_11.m_backend.data._M_elems._0_8_ = uVar23;
    if ((((fpclass_type)local_4a0 == cpp_dec_float_NaN) ||
        (enterVal.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar30 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&enterVal.m_backend,&result_11.m_backend), -1 < iVar30))
    goto LAB_003bef67;
  }
  lVar35 = (long)rhs->memused;
  if (0 < lVar35) {
    pVVar11 = this->theFrhs;
    uVar38 = lVar35 + 1;
    lVar35 = lVar35 * 0x54;
    do {
      pcVar34 = (cpp_dec_float<100U,_int,_void> *)
                ((long)rhs->m_elem[-1].val.m_backend.data._M_elems + lVar35);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x10;
      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems._56_5_ = 0;
      result.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      pcVar36 = &enterVal.m_backend;
      if (pcVar34 != &result.m_backend) {
        result.m_backend.data._M_elems[0xc] = enterVal.m_backend.data._M_elems[0xc];
        result.m_backend.data._M_elems[0xd] = enterVal.m_backend.data._M_elems[0xd];
        result.m_backend.data._M_elems._56_5_ = enterVal.m_backend.data._M_elems._56_5_;
        result.m_backend.data._M_elems[0xf]._1_3_ = enterVal.m_backend.data._M_elems[0xf]._1_3_;
        result.m_backend.data._M_elems[10] = enterVal.m_backend.data._M_elems[10];
        result.m_backend.data._M_elems[0xb] = enterVal.m_backend.data._M_elems[0xb];
        result.m_backend.data._M_elems[8] = enterVal.m_backend.data._M_elems[8];
        result.m_backend.data._M_elems[9] = enterVal.m_backend.data._M_elems[9];
        result.m_backend.data._M_elems[6] = enterVal.m_backend.data._M_elems[6];
        result.m_backend.data._M_elems[7] = enterVal.m_backend.data._M_elems[7];
        result.m_backend.data._M_elems[4] = enterVal.m_backend.data._M_elems[4];
        result.m_backend.data._M_elems[5] = enterVal.m_backend.data._M_elems[5];
        result.m_backend.data._M_elems[2] = enterVal.m_backend.data._M_elems[2];
        result.m_backend.data._M_elems[3] = enterVal.m_backend.data._M_elems[3];
        result.m_backend.data._M_elems[0] = enterVal.m_backend.data._M_elems[0];
        result.m_backend.data._M_elems[1] = enterVal.m_backend.data._M_elems[1];
        result.m_backend.exp = enterVal.m_backend.exp;
        result.m_backend.neg = enterVal.m_backend.neg;
        result.m_backend.fpclass = enterVal.m_backend.fpclass;
        result.m_backend.prec_elem = enterVal.m_backend.prec_elem;
        pcVar36 = pcVar34;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&result.m_backend,pcVar36);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&(pVVar11->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(int *)((long)(&rhs->m_elem[-1].val + 1) + lVar35)].m_backend,&result.m_backend)
      ;
      uVar38 = uVar38 - 1;
      lVar35 = lVar35 + -0x54;
    } while (1 < uVar38);
  }
LAB_003bef67:
  local_268[0].m_backend.data._M_elems[0xf]._1_3_ = uStack_5eb;
  local_268[0].m_backend.data._M_elems._56_5_ = uStack_5f0;
  local_268[0].m_backend.data._M_elems[0xc] = local_628[0xc];
  local_268[0].m_backend.data._M_elems[0xd] = local_628[0xd];
  local_268[0].m_backend.data._M_elems[8] = local_628[8];
  local_268[0].m_backend.data._M_elems[9] = local_628[9];
  local_268[0].m_backend.data._M_elems[10] = local_628[10];
  local_268[0].m_backend.data._M_elems[0xb] = local_628[0xb];
  local_268[0].m_backend.data._M_elems[4] = local_628[4];
  local_268[0].m_backend.data._M_elems[5] = local_628[5];
  local_268[0].m_backend.data._M_elems[6] = local_628[6];
  local_268[0].m_backend.data._M_elems[7] = local_628[7];
  local_268[0].m_backend.data._M_elems[0] = local_628[0];
  local_268[0].m_backend.data._M_elems[1] = local_628[1];
  local_268[0].m_backend.data._M_elems[2] = local_628[2];
  local_268[0].m_backend.data._M_elems[3] = local_628[3];
  local_268[0].m_backend.exp = iStack_5e8;
  local_268[0].m_backend.neg = (bool)uStack_5e4;
  local_268[0].m_backend.fpclass = (fpclass_type)local_5e0;
  local_268[0].m_backend.prec_elem = local_5e0._4_4_;
  updateNonbasicValue(this,local_268);
  (**(this->
     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     )._vptr_SPxBasisBase)
            (&this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,(ulong)uVar31,enterId,rhs,&this->theFvec->thedelta);
  return bVar46;
}

Assistant:

bool SPxSolverBase<R>::enter(SPxId& enterId, bool polish)
{
   assert(enterId.isValid());
   assert(type() == ENTER);
   assert(initialized);

   SPxId none;          // invalid id used when enter fails
   R enterTest;      // correct test value of entering var
   R enterUB;        // upper bound of entering variable
   R enterLB;        // lower bound of entering variable
   R enterVal;       // current value of entering variable
   R enterMax;       // maximum value for entering shift
   R enterPric;      // priced value of entering variable
   typename SPxBasisBase<R>::Desc::Status enterStat;      // status of entering variable
   R enterRO;        // rhs/obj of entering variable
   StableSum<R> objChange;
   const SVectorBase<R>* enterVec = enterVector(enterId);

   bool instable = instableEnter;
   assert(!instable || instableEnterId.isValid());

   getEnterVals(enterId, enterTest, enterUB, enterLB,
                enterVal, enterMax, enterPric, enterStat, enterRO, objChange);

   if(!polish && enterTest > -epsilon())
   {
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      SPxOut::debug(this, "DENTER08 rejecting false enter pivot\n");

      return false;
   }

   /*  Before performing the actual basis update, we must determine, how this
       is to be accomplished.
   */
   // BH 2005-11-15: Obviously solve4update() is only called if theFvec.delta()
   // is setup (i.e. the indices of the NZEs are stored within it) and there are
   // 0 NZEs (???).
   // In that case theFvec->delta() is set such that
   //   Base * theFvec->delta() = enterVec
   if(theFvec->delta().isSetup() && theFvec->delta().size() == 0)
      SPxBasisBase<R>::solve4update(theFvec->delta(), *enterVec);

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      // BH 2005-11-29: This code block seems to check the assertion
      //   || Base * theFvec->delta() - enterVec ||_2 <= entertol()
      VectorBase<R> tmp(dim());
      // BH 2005-11-15: This cast is necessary since SSVectorBase<R>  inherits protected from VectorBase<R>.
      tmp = reinterpret_cast<VectorBase<R>&>(theFvec->delta());
      this->multBaseWith(tmp);
      tmp -= *enterVec;

      if(tmp.length() > entertol())
      {
         // This happens frequently and does usually not hurt, so print these
         // warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WENTER09 fVec updated error = "
                       << tmp.length() << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(-enterMax > 0)
         perturbMaxEnter();
      else
         perturbMinEnter();
   }

   R leaveVal = -enterMax;

   boundflips = 0;
   int leaveIdx = theratiotester->selectLeave(leaveVal, enterTest, polish);

   /* in row representation, fixed columns and rows should not leave the basis */
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxColId()
          || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxRowId()
          || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);

   instableEnterVal = 0;
   instableEnterId = SPxId();
   instableEnter = false;

   /*
     We now tried to find a variable to leave the basis. If one has been
     found, a regular basis update is to be performed.
   */
   if(leaveIdx >= 0)
   {
      if(spxAbs(leaveVal) < entertol())
      {
         if(NE(theUBbound[leaveIdx], theLBbound[leaveIdx], this->tolerances()->epsilon())
               && enterStat != SPxBasisBase<R>::Desc::P_FREE && enterStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            enterCycles++;
         }
      }
      else
         m_numCycle /= 2;

      // setup for updating the copricing vector
      if(coSolveVector3 && coSolveVector2)
      {
         assert(coSolveVector2->isConsistent());
         assert(coSolveVector2rhs->isSetup());
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, *coSolveVector3
                                  , unitVecs[leaveIdx], *coSolveVector2rhs, *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector3)
      {
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector3, unitVecs[leaveIdx],
                                  *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector2)
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, unitVecs[leaveIdx],
                                  *coSolveVector2rhs);
      else
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);

      if(boundflips > 0)
      {
         for(int i = coSolveVector3->dim() - 1; i >= 0; --i)
         {
            if(spxAbs((*coSolveVector3)[i]) > epsilon())
               (*thePvec).multAdd(-(*coSolveVector3)[i], (*thecovectors)[i]);
         }

         // we need to update enterPric in case it was changed by bound flips
         if(enterId.isSPxColId())
            enterPric = (*theCoPvec)[this->number(SPxColId(enterId))];
         else
            enterPric = (*thePvec)[this->number(SPxRowId(enterId))];

         SPxOut::debug(this, "IEBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
         totalboundflips += boundflips;
      }

      (*theCoPrhs)[leaveIdx] = enterRO;
      theCoPvec->value() = (enterRO - enterPric) / theFvec->delta()[leaveIdx];

      if(theCoPvec->value() > epsilon() || theCoPvec->value() < -epsilon())
      {
         if(pricing() == FULL)
         {
            thePvec->value() = theCoPvec->value();
            setupPupdate();
         }

         doPupdate();
      }

      assert(thePvec->isConsistent());
      assert(theCoPvec->isConsistent());

      assert(!this->baseId(leaveIdx).isSPxRowId()
             || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);
      assert(!this->baseId(leaveIdx).isSPxColId()
             || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);

      R leavebound;             // bound on which leaving variable moves

      try
      {
         getEnterVals2(leaveIdx, enterMax, leavebound, objChange);
      }
      catch(const SPxException& F)
      {
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
         throw F;
      }

      //  process entering variable
      theUBbound[leaveIdx] = enterUB;
      theLBbound[leaveIdx] = enterLB;

      //  compute tests:
      updateCoTest();

      if(pricing() == FULL)
         updateTest();

      // update feasibility vectors
      theFvec->value() = leaveVal;
      theFvec->update();
      (*theFvec)[leaveIdx] = enterVal - leaveVal;

      if(leavebound > epsilon() || leavebound < -epsilon())
         theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

      if(enterVal > epsilon() || enterVal < -epsilon())
         theFrhs->multAdd(enterVal, *enterVec);

      // update objective funtion value
      updateNonbasicValue(objChange);

      //  change basis matrix
      this->change(leaveIdx, enterId, enterVec, &(theFvec->delta()));

      return true;
   }
   /*  No leaving vector could be found that would yield a stable pivot step.
    */
   else if(NE(leaveVal, -enterMax, this->tolerances()->epsilon()))
   {
      /* In the ENTER algorithm, when for a selected entering variable we find only
         an instable leaving variable, then the basis change is not conducted.
         Instead, we save the entering variable's id in instableEnterId and set
         the test value to zero, hoping to find a different leaving
         variable with a stable leavingvariable.
         If this fails, however, and no more entering variable is found, we have to
         perform the instable basis change using instableEnterId. In this (and only
         in this) case, the flag instableEnter is set to true.

         leaveVal != enterMax is the case that selectLeave has found only an instable leaving
         variable. We store this leaving variable for later if we are not already in the
         instable case */

      if(!instable)
      {
         instableEnterId = enterId;
         instableEnterVal = enterTest;

         SPxOut::debug(this, "DENTER09 rejecting enter pivot and looking for others\n");

         rejectEnter(enterId, enterTest / 10.0, enterStat);
         this->change(-1, none, nullptr);
      }
      else
      {
         SPxOut::debug(this, "DENTER10 rejecting enter pivot in instable state, resetting values\n");
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
      }

      return false;
   }
   /*  No leaving vector has been selected from the basis. However, if the
       shift amount for |fVec| is bounded, we are in the case, that the
       entering variable is moved from one bound to its other, before any of
       the basis feasibility variables reaches their bound. This may only
       happen in primal/columnwise case with upper and lower bounds on
       variables.
   */
   else if(!polish && leaveVal < R(infinity) && leaveVal > R(-infinity))
   {
      assert(rep() == COLUMN);
      assert(EQ(leaveVal, -enterMax, this->epsilon()));

      this->change(-1, enterId, enterVec);

      theFvec->value() = leaveVal;
      theFvec->update();

      ungetEnterVal(enterId, enterStat, leaveVal, *enterVec, objChange);

      // update objective funtion value
      updateNonbasicValue(objChange);

      SPxOut::debug(this, "DENTER11 moving entering variable from one bound to the other\n");

      return false;
   }
   /*  No variable could be selected to leave the basis and even the entering
       variable is unbounded --- this is a failure.
   */
   else
   {
      /* The following line originally was in the "lastUpdate() > 1" case;
         we need it in the INFEASIBLE/UNBOUNDED case, too, to have the
         basis descriptor at the correct size.
      */
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      if(polish)
         return false;

      else if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER01 factorization triggered in "
                       << "enter() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the entering column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return false;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation
       * ROW: recompute the primal variables and activities for another, more precise, round of pricing
       */
      else if(spxAbs(enterTest) < entertol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "IENTER11 clean up step to reduce numerical errors" <<
                       std::endl;)

         SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
         computePvec();
         computeCoTest();
         computeTest();

         return false;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER02 unboundedness/infeasibility found in "
                    << "enter()" << std::endl;)

      if(rep() == ROW)
      {
         computeDualfarkas4Row(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }
      /**@todo if shift() is not zero, we must not conclude primal unboundedness */
      else
      {
         computePrimalray4Col(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }

      return false;
   }
}